

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall
embree::SceneGraphFlattener::convertInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node,
          vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          *spaces)

{
  Vector *pVVar1;
  LinearSpace3<embree::Vec3fx> *pLVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  ulong *puVar6;
  float *pfVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  undefined1 auVar10 [16];
  byte bVar11;
  byte bVar12;
  Node *pNVar13;
  size_t sVar14;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar15;
  long lVar16;
  Ref<embree::SceneGraph::Node> *pRVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined4 uVar59;
  BBox1f this_00;
  long *plVar60;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar61;
  long *plVar62;
  undefined7 uVar65;
  long *plVar63;
  runtime_error *prVar64;
  byte bVar66;
  size_t *extraout_RDX;
  size_t *psVar67;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  size_t *extraout_RDX_02;
  size_t *extraout_RDX_03;
  size_t *extraout_RDX_04;
  size_t *extraout_RDX_05;
  size_t *extraout_RDX_06;
  size_t *extraout_RDX_07;
  size_t *extraout_RDX_08;
  size_t *extraout_RDX_09;
  size_t *extraout_RDX_10;
  size_t *extraout_RDX_11;
  size_t *extraout_RDX_12;
  size_t *extraout_RDX_13;
  size_t *extraout_RDX_14;
  size_t *extraout_RDX_15;
  size_t *extraout_RDX_16;
  size_t *extraout_RDX_17;
  size_t *extraout_RDX_18;
  size_t *extraout_RDX_19;
  size_t *extraout_RDX_20;
  size_t *extraout_RDX_21;
  size_t *extraout_RDX_22;
  long lVar68;
  undefined8 *puVar69;
  Ref<embree::SceneGraph::Node> *child;
  ulong uVar70;
  Ref<embree::SceneGraph::Node> *pRVar71;
  uint uVar72;
  int iVar73;
  uint uVar74;
  int iVar75;
  float fVar76;
  undefined1 auVar78 [16];
  float fVar89;
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  Transformations c;
  float local_188;
  float fStack_184;
  float local_178;
  float fStack_174;
  float local_168;
  Transformations local_158;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
  *local_98;
  SceneGraphFlattener *local_90;
  undefined8 local_88;
  ulong uStack_80;
  long *local_70;
  Ref<embree::SceneGraph::Node> *local_68;
  Node *local_60;
  undefined1 local_58 [16];
  pointer local_48;
  _Base_ptr local_38;
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  
  pNVar13 = node->ptr;
  local_98 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              *)group;
  local_90 = this;
  if (pNVar13->closed == true) {
    this_00 = (BBox1f)alignedMalloc(0x88,0x10);
    local_60 = node->ptr;
    if (local_60 != (Node *)0x0) {
      (*(local_60->super_RefCount)._vptr_RefCount[2])();
    }
    lookupGeometries((SceneGraphFlattener *)local_58,&local_90->node);
    SceneGraph::MultiTransformNode::MultiTransformNode
              ((MultiTransformNode *)this_00,spaces,(Ref<embree::SceneGraph::Node> *)local_58);
    local_158.time_range = this_00;
    (**(code **)(*(long *)this_00 + 0x10))(this_00);
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
    ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
              (local_98,(Ref<embree::SceneGraph::Node> *)&local_158);
    if (local_158.time_range != (BBox1f)0x0) {
      (**(code **)(*(long *)local_158.time_range + 0x18))();
    }
    if ((Node *)local_58._0_8_ != (Node *)0x0) {
      (*((RefCount *)local_58._0_8_)->_vptr_RefCount[3])();
    }
    if (local_60 != (Node *)0x0) {
      (*(local_60->super_RefCount)._vptr_RefCount[3])();
    }
  }
  else {
    if (pNVar13 == (Node *)0x0) {
      plVar60 = (long *)0x0;
    }
    else {
      plVar60 = (long *)__dynamic_cast(pNVar13,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::TransformNode::typeinfo,0);
    }
    local_38 = (_Base_ptr)spaces;
    if (plVar60 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar62 = (long *)0x0;
      }
      else {
        plVar62 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::MultiTransformNode::typeinfo,0);
      }
      local_70 = plVar62;
      if (plVar62 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          plVar63 = (long *)0x0;
        }
        else {
          plVar63 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                           &SceneGraph::GroupNode::typeinfo,0);
        }
        if (plVar63 != (long *)0x0) {
          (**(code **)(*plVar63 + 0x10))(plVar63);
          pRVar17 = (Ref<embree::SceneGraph::Node> *)plVar63[0xe];
          for (pRVar71 = (Ref<embree::SceneGraph::Node> *)plVar63[0xd]; pRVar71 != pRVar17;
              pRVar71 = pRVar71 + 1) {
            convertInstances(local_90,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                       *)local_98,pRVar71,spaces);
          }
        }
        if (plVar63 != (long *)0x0) {
          (**(code **)(*plVar63 + 0x18))(plVar63);
        }
      }
      else {
        (**(code **)(*plVar62 + 0x10))(plVar62);
        if ((long)(spaces->
                  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(spaces->
                  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  )._M_impl.super__Vector_impl_data._M_start != plVar62[0xe] - plVar62[0xd]) {
          prVar64 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar64,"number of transformations does not match");
          __cxa_throw(prVar64,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_58._0_8_ = (Node *)0x0;
        local_58._8_8_ = (pointer)0x0;
        local_48 = (pointer)0x0;
        pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                  (spaces->
                  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
            (spaces->
            super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
            )._M_impl.super__Vector_impl_data._M_finish != pAVar61) {
          pRVar71 = (Ref<embree::SceneGraph::Node> *)0x0;
          do {
            psVar67 = &local_158.spaces.size_active;
            pLVar2 = &pAVar61->l + (long)pRVar71;
            puVar69 = (undefined8 *)(local_70[0xd] + (long)pRVar71 * 0x30);
            sVar14 = *(size_t *)&(&pAVar61->l)[(long)pRVar71].vy.field_0;
            local_68 = pRVar71;
            if (sVar14 == 1) {
              uVar8 = *(undefined8 *)&(pLVar2->vx).field_0;
              fVar76 = (float)uVar8;
              fVar103 = (float)((ulong)uVar8 >> 0x20);
              fVar127 = (float)*puVar69;
              fVar128 = (float)((ulong)*puVar69 >> 0x20);
              uVar72 = -(uint)(fVar76 < fVar127);
              uVar74 = -(uint)(fVar103 < fVar128);
              sVar14 = puVar69[2];
              local_158.time_range.upper = (float)(~uVar74 & (uint)fVar128 | (uint)fVar103 & uVar74)
              ;
              local_158.time_range.lower = (float)(~uVar72 & (uint)fVar76 | (uint)fVar127 & uVar72);
              local_158.spaces.size_active = 0;
              local_158.spaces.size_alloced = 0;
              local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
              if (sVar14 != 0) {
                pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                          alignedMalloc(sVar14 << 6,0x10);
                psVar67 = extraout_RDX_11;
                local_158.spaces.size_alloced = sVar14;
                local_158.spaces.items = pAVar61;
              }
              local_158.quaternion = false;
              local_158.spaces.size_active = local_158.spaces.size_alloced;
              if (puVar69[2] != 0) {
                lVar68 = 0x30;
                uVar70 = 0;
                do {
                  uVar72 = (uint)psVar67;
                  pAVar15 = *(AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **)
                             &(pLVar2->vz).field_0;
                  lVar16 = puVar69[4];
                  bVar11 = *(undefined1 *)((long)&(pLVar2->vz).field_0 + 8);
                  bVar12 = *(byte *)(puVar69 + 5);
                  local_158.quaternion = false;
                  fVar76 = (pAVar15->l).vx.field_0.m128[0];
                  uVar8 = *(undefined8 *)((long)&(pAVar15->l).vx.field_0 + 4);
                  fVar103 = (float)((ulong)uVar8 >> 0x20);
                  local_188 = (float)uVar8;
                  if ((((fVar76 != 1.0) || (NAN(fVar76))) || (local_188 != 0.0)) ||
                     (((NAN(local_188) || (fVar103 != 0.0)) || (NAN(fVar103))))) {
LAB_0016a0e1:
                    uVar8 = *(undefined8 *)(lVar16 + -0x30 + lVar68);
                    fVar127 = (float)uVar8;
                    fVar128 = (float)((ulong)uVar8 >> 0x20);
                    iVar73 = -(uint)(fVar127 != 1.0);
                    iVar75 = -(uint)(fVar128 != 0.0);
                    auVar84._4_4_ = iVar75;
                    auVar84._0_4_ = iVar73;
                    auVar84._8_4_ = iVar75;
                    auVar84._12_4_ = iVar75;
                    auVar83._8_8_ = auVar84._8_8_;
                    auVar83._4_4_ = iVar73;
                    auVar83._0_4_ = iVar73;
                    uVar72 = movmskpd(uVar72,auVar83);
                    psVar67 = (size_t *)(ulong)uVar72;
                    fVar76 = *(float *)(lVar16 + -0x28 + lVar68);
                    if ((uVar72 & 1) == 0) {
                      bVar66 = (byte)uVar72 >> 1;
                      uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                      psVar67 = (size_t *)(ulong)uVar72;
                      if (((bVar66 == 0) && (fVar76 == 0.0)) && (!NAN(fVar76))) {
                        pfVar3 = (float *)(lVar16 + -0x24 + lVar68);
                        auVar50._4_4_ = -(uint)(pfVar3[1] != 0.0);
                        auVar50._0_4_ = -(uint)(*pfVar3 != 0.0);
                        auVar50._8_4_ = -(uint)(pfVar3[2] != 1.0);
                        auVar50._12_4_ = -(uint)(pfVar3[3] != 0.0);
                        uVar72 = movmskps(uVar72,auVar50);
                        psVar67 = (size_t *)(ulong)uVar72;
                        if ((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                           ((uVar72 & 4) == 0)) {
                          bVar66 = ((byte)uVar72 & 8) >> 3;
                          uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                          psVar67 = (size_t *)(ulong)uVar72;
                          if (bVar66 == 0) {
                            pfVar3 = (float *)(lVar16 + -0x14 + lVar68);
                            auVar51._4_4_ = -(uint)(pfVar3[1] != 0.0);
                            auVar51._0_4_ = -(uint)(*pfVar3 != 0.0);
                            auVar51._8_4_ = -(uint)(pfVar3[2] != 0.0);
                            auVar51._12_4_ = -(uint)(pfVar3[3] != 1.0);
                            uVar72 = movmskps(uVar72,auVar51);
                            psVar67 = (size_t *)(ulong)uVar72;
                            if ((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                               ((uVar72 & 4) == 0)) {
                              bVar66 = ((byte)uVar72 & 8) >> 3;
                              uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                              psVar67 = (size_t *)(ulong)uVar72;
                              if (bVar66 == 0) {
                                pfVar3 = (float *)(lVar16 + -4 + lVar68);
                                auVar52._4_4_ = -(uint)(pfVar3[1] != 0.0);
                                auVar52._0_4_ = -(uint)(*pfVar3 != 0.0);
                                auVar52._8_4_ = -(uint)(pfVar3[2] != 0.0);
                                auVar52._12_4_ = -(uint)(pfVar3[3] != 0.0);
                                uVar72 = movmskps(uVar72,auVar52);
                                psVar67 = (size_t *)(ulong)uVar72;
                                if ((((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                                     ((uVar72 & 4) == 0)) &&
                                    (bVar66 = ((byte)uVar72 & 8) >> 3,
                                    psVar67 = (size_t *)(ulong)CONCAT31((int3)(uVar72 >> 8),bVar66),
                                    bVar66 == 0)) &&
                                   ((bVar12 == 0 ||
                                    ((fVar113 = *(float *)(lVar16 + 0xc + lVar68), fVar113 == 1.0 &&
                                     (!NAN(fVar113))))))) {
                                  fVar101 = (pAVar15->l).vx.field_0.m128[0];
                                  local_188 = (pAVar15->l).vx.field_0.m128[1];
                                  fVar103 = (pAVar15->l).vx.field_0.m128[2];
                                  fVar76 = (pAVar15->l).vx.field_0.m128[3];
                                  fVar127 = (pAVar15->l).vy.field_0.m128[0];
                                  fVar116 = (pAVar15->l).vy.field_0.m128[1];
                                  fVar119 = (pAVar15->l).vy.field_0.m128[2];
                                  fVar113 = (pAVar15->l).vy.field_0.m128[3];
                                  fVar122 = (pAVar15->l).vz.field_0.m128[0];
                                  fVar104 = (pAVar15->l).vz.field_0.m128[1];
                                  fVar107 = (pAVar15->l).vz.field_0.m128[2];
                                  fVar106 = (pAVar15->l).vz.field_0.m128[3];
                                  fVar128 = (pAVar15->p).field_0.m128[0];
                                  fVar100 = (pAVar15->p).field_0.m128[1];
                                  fVar90 = (pAVar15->p).field_0.m128[2];
                                  fVar108 = (pAVar15->p).field_0.m128[3];
                                  local_158.quaternion = (bool)bVar11;
                                  goto LAB_0016abd7;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    if ((bVar11 == 0) && (bVar12 == 0)) {
                      fVar138 = (pAVar15->l).vx.field_0.m128[0];
                      fVar89 = (pAVar15->l).vx.field_0.m128[1];
                      fVar91 = (pAVar15->l).vx.field_0.m128[2];
                      fVar92 = (pAVar15->l).vx.field_0.m128[3];
                      fVar93 = (pAVar15->l).vy.field_0.m128[0];
                      fVar94 = (pAVar15->l).vy.field_0.m128[1];
                      fVar95 = (pAVar15->l).vy.field_0.m128[2];
                      fVar96 = (pAVar15->l).vy.field_0.m128[3];
                      fVar97 = (pAVar15->l).vz.field_0.m128[0];
                      fVar98 = (pAVar15->l).vz.field_0.m128[1];
                      fVar102 = (pAVar15->l).vz.field_0.m128[2];
                      fVar136 = (pAVar15->l).vz.field_0.m128[3];
                      fVar101 = fVar127 * fVar138 + fVar128 * fVar93 + fVar76 * fVar97;
                      local_188 = fVar127 * fVar89 + fVar128 * fVar94 + fVar76 * fVar98;
                      fVar103 = fVar127 * fVar91 + fVar128 * fVar95 + fVar76 * fVar102;
                      fVar116 = *(float *)(lVar16 + -0x20 + lVar68);
                      fVar99 = *(float *)(lVar16 + -0x1c + lVar68);
                      fVar129 = *(float *)(lVar16 + -0x18 + lVar68);
                      fVar106 = *(float *)(lVar16 + -0x10 + lVar68);
                      fVar119 = fVar116 * fVar91 + fVar99 * fVar95 + fVar129 * fVar102;
                      fVar113 = fVar116 * fVar92 + fVar99 * fVar96 + fVar129 * fVar136;
                      fVar100 = *(float *)(lVar16 + -0xc + lVar68);
                      fVar90 = *(float *)(lVar16 + -8 + lVar68);
                      fVar122 = fVar106 * fVar138 + fVar100 * fVar93 + fVar90 * fVar97;
                      fVar104 = fVar106 * fVar89 + fVar100 * fVar94 + fVar90 * fVar98;
                      fVar107 = fVar106 * fVar91 + fVar100 * fVar95 + fVar90 * fVar102;
                      fVar108 = *(float *)(lVar16 + lVar68);
                      fVar130 = *(float *)(lVar16 + 4 + lVar68);
                      fVar135 = *(float *)(lVar16 + 8 + lVar68);
                      fVar106 = fVar106 * fVar92 + fVar100 * fVar96 + fVar90 * fVar136;
                      fVar76 = fVar127 * fVar92 + fVar128 * fVar96 + fVar76 * fVar136;
                      fVar128 = fVar108 * fVar138 + fVar130 * fVar93 + fVar135 * fVar97 +
                                (pAVar15->p).field_0.m128[0];
                      fVar100 = fVar108 * fVar89 + fVar130 * fVar94 + fVar135 * fVar98 +
                                (pAVar15->p).field_0.m128[1];
                      fVar90 = fVar108 * fVar91 + fVar130 * fVar95 + fVar135 * fVar102 +
                               (pAVar15->p).field_0.m128[2];
                      fVar108 = fVar108 * fVar92 + fVar130 * fVar96 + fVar135 * fVar136 +
                                (pAVar15->p).field_0.m128[3];
                      fVar127 = fVar116 * fVar138 + fVar99 * fVar93 + fVar129 * fVar97;
                      fVar116 = fVar116 * fVar89 + fVar99 * fVar94 + fVar129 * fVar98;
                    }
                    else if ((bVar11 == 0) || (bVar12 == 0)) {
                      if ((bVar11 == 0) || (bVar12 != 0)) {
                        if ((local_188 != 0.0) ||
                           ((((NAN(local_188) || (fVar103 != 0.0)) || (NAN(fVar103))) ||
                            (uVar8 = *(undefined8 *)&(pAVar15->l).vz.field_0,
                            auVar32._4_4_ = -(uint)((pAVar15->l).vy.field_0.m128[0] != 0.0),
                            auVar32._0_4_ = -(uint)((pAVar15->l).vy.field_0.m128[2] != 0.0),
                            auVar32._8_4_ = -(uint)((float)uVar8 != 0.0),
                            auVar32._12_4_ = -(uint)((float)((ulong)uVar8 >> 0x20) != 0.0),
                            uVar59 = movmskps((int)CONCAT71((int7)((ulong)pAVar61 >> 8),bVar12),
                                              auVar32), (char)uVar59 != '\0')))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                     ,0x83);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                          std::ostream::put(-0x30);
                          std::ostream::flush();
                          psVar67 = extraout_RDX_14;
                        }
                        pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                        fVar76 = pfVar3[3];
                        pfVar4 = (float *)(lVar16 + -0x20 + lVar68);
                        fVar127 = *pfVar4;
                        fVar113 = pfVar4[3];
                        pfVar5 = (float *)(lVar16 + -0x10 + lVar68);
                        fVar122 = *pfVar5;
                        fVar104 = pfVar5[1];
                        fVar106 = pfVar5[3];
                        pfVar7 = (float *)(lVar16 + lVar68);
                        fVar128 = *pfVar7;
                        fVar100 = pfVar7[1];
                        fVar90 = pfVar7[2];
                        fVar108 = pfVar7[3];
                        uVar8 = *(undefined8 *)&(pAVar15->p).field_0;
                        fVar101 = (pAVar15->l).vx.field_0.m128[0] * *pfVar3;
                        local_188 = pfVar3[1] + (float)uVar8;
                        fVar103 = pfVar3[2] + (float)((ulong)uVar8 >> 0x20);
                        fVar119 = pfVar4[2] + (pAVar15->p).field_0.m128[2];
                        fVar116 = pfVar4[1] * (pAVar15->l).vy.field_0.m128[1];
                        fVar107 = pfVar5[2] * (pAVar15->l).vz.field_0.m128[2];
                        local_158.quaternion = true;
                      }
                      else {
                        local_e8 = ZEXT416((uint)(pAVar15->p).field_0.m128[3]);
                        local_c8 = ZEXT416((uint)(pAVar15->l).vx.field_0.m128[3]);
                        _local_f8 = ZEXT416((uint)(pAVar15->l).vz.field_0.m128[3]);
                        local_108 = (pAVar15->l).vy.field_0.m128[0];
                        fStack_104 = (pAVar15->l).vy.field_0.m128[1];
                        fStack_fc = (pAVar15->l).vy.field_0.m128[3];
                        pVVar1 = &(pAVar15->l).vz;
                        fVar76 = (pVVar1->field_0).m128[0];
                        fVar127 = (pAVar15->l).vz.field_0.m128[1];
                        local_118 = *(undefined8 *)&pVVar1->field_0;
                        pfVar3 = (pAVar15->l).vz.field_0.m128 + 2;
                        fVar128 = *pfVar3;
                        fVar113 = (pAVar15->l).vz.field_0.m128[3];
                        uStack_110 = *(undefined8 *)pfVar3;
                        local_d8._8_8_ = 0;
                        local_d8._0_8_ = *(ulong *)((long)&(pAVar15->l).vy.field_0 + 8);
                        local_a8 = (pAVar15->l).vx.field_0.m128[0];
                        fStack_9c = (pAVar15->l).vx.field_0.m128[1];
                        pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                        fVar122 = *pfVar3;
                        fVar104 = pfVar3[1];
                        fVar106 = pfVar3[2];
                        pfVar3 = (float *)(lVar16 + -0x20 + lVar68);
                        fVar100 = *pfVar3;
                        fVar90 = pfVar3[1];
                        fVar108 = pfVar3[2];
                        puVar6 = (ulong *)(lVar16 + -0x10 + lVar68);
                        local_88 = *puVar6;
                        uStack_80 = puVar6[1];
                        pfVar3 = (float *)(lVar16 + lVar68);
                        fVar116 = *pfVar3;
                        fVar119 = pfVar3[1];
                        fVar107 = pfVar3[2];
                        fVar101 = fVar122 * local_a8 + fVar104 * local_108 + fVar106 * fVar76;
                        fVar99 = fVar122 * 0.0 + fVar104 * fStack_104 + fVar106 * fVar127;
                        fVar122 = fVar122 * 0.0 + fVar104 * 0.0 + fVar106 * fVar128;
                        local_128 = fVar100 * local_a8 + fVar90 * local_108 + fVar108 * fVar76;
                        fStack_124 = fVar100 * 0.0 + fVar90 * fStack_104 + fVar108 * fVar127;
                        fStack_120 = fVar100 * 0.0 + fVar90 * 0.0 + fVar108 * fVar128;
                        fStack_11c = fVar100 * fStack_9c + fVar90 * fStack_fc + fVar108 * fVar113;
                        fStack_100 = 0.0;
                        fStack_a4 = 0.0;
                        fStack_a0 = 0.0;
                        local_b8._4_4_ =
                             fVar116 * 0.0 + fVar119 * fStack_104 + fVar107 * fVar127 +
                             (pAVar15->p).field_0.m128[1];
                        local_b8._0_4_ =
                             fVar116 * local_a8 + fVar119 * local_108 + fVar107 * fVar76 +
                             (pAVar15->p).field_0.m128[0];
                        fStack_b0 = fVar116 * 0.0 + fVar119 * 0.0 + fVar107 * fVar128 +
                                    (pAVar15->p).field_0.m128[2];
                        fStack_ac = fVar116 * fStack_9c + fVar119 * fStack_fc + fVar107 * fVar113 +
                                    (pAVar15->p).field_0.m128[3];
                        if ((((fVar99 != 0.0) || (NAN(fVar99))) ||
                            ((fVar122 != 0.0 || ((NAN(fVar122) || (fStack_120 != 0.0)))))) ||
                           (NAN(fStack_120))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                     ,0x61);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                          std::ostream::put(-0x30);
                          std::ostream::flush();
                          psVar67 = extraout_RDX_13;
                        }
                        fVar122 = local_a8 * (float)local_88 +
                                  local_108 * local_88._4_4_ + (float)local_118 * (float)uStack_80;
                        fVar104 = fStack_a4 * (float)local_88 +
                                  fStack_104 * local_88._4_4_ + local_118._4_4_ * (float)uStack_80;
                        fVar107 = fStack_a0 * (float)local_88 +
                                  fStack_100 * local_88._4_4_ + (float)uStack_110 * (float)uStack_80
                        ;
                        local_158.quaternion = true;
                        fVar119 = local_d8._0_4_;
                        fVar113 = local_d8._4_4_;
                        fVar106 = (float)local_f8._0_4_;
                        fVar76 = (float)local_c8._0_4_;
                        fVar128 = (float)local_b8._0_4_;
                        fVar100 = (float)local_b8._4_4_;
                        fVar90 = fStack_b0;
                        fVar108 = (float)local_e8._0_4_;
                        fVar127 = local_128;
                        fVar116 = fStack_124;
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                 ,0x67);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                      std::ostream::put(-0x30);
                      std::ostream::flush();
                      fVar76 = (pAVar15->p).field_0.m128[3];
                      fVar103 = (pAVar15->l).vx.field_0.m128[3];
                      fVar127 = (pAVar15->l).vy.field_0.m128[3];
                      fVar128 = (pAVar15->l).vz.field_0.m128[3];
                      aVar9 = (pAVar15->l).vx.field_0.field_1;
                      fVar113 = (pAVar15->l).vy.field_0.m128[0];
                      fVar122 = (pAVar15->l).vy.field_0.m128[1];
                      fVar104 = (pAVar15->l).vz.field_0.m128[0];
                      fVar106 = (pAVar15->l).vz.field_0.m128[1];
                      fVar100 = (pAVar15->l).vz.field_0.m128[2];
                      fVar130 = fVar103 * fVar127 + fVar76 * fVar128;
                      fVar101 = fVar103 * fVar127 - fVar76 * fVar128;
                      fVar119 = fVar76 * fVar76 + fVar103 * fVar103 + -fVar127 * fVar127 +
                                -fVar128 * fVar128;
                      fVar107 = fVar76 * fVar76 - fVar103 * fVar103;
                      fVar129 = fVar127 * fVar127 + fVar107 + -fVar128 * fVar128;
                      fVar138 = fVar103 * fVar128 - fVar76 * fVar127;
                      fVar90 = fVar76 * fVar127 + fVar103 * fVar128;
                      fVar135 = fVar127 * fVar128 + fVar76 * fVar103;
                      fVar76 = fVar127 * fVar128 - fVar76 * fVar103;
                      fVar108 = (pAVar15->p).field_0.m128[0];
                      fVar116 = (pAVar15->p).field_0.m128[1];
                      fVar99 = (pAVar15->p).field_0.m128[2];
                      fVar130 = fVar130 + fVar130;
                      fVar138 = fVar138 + fVar138;
                      fVar101 = fVar101 + fVar101;
                      fVar135 = fVar135 + fVar135;
                      fVar90 = fVar90 + fVar90;
                      fVar76 = fVar76 + fVar76;
                      fVar103 = fVar128 * fVar128 + fVar107 + -fVar127 * fVar127;
                      fVar110 = fVar119 * 1.0 + fVar130 * 0.0 + fVar138 * 0.0;
                      fVar112 = fVar119 * 0.0 + fVar130 * 1.0 + fVar138 * 0.0;
                      fVar115 = fVar119 * 0.0 + fVar130 * 0.0 + fVar138 * 1.0;
                      fVar117 = fVar119 * 0.0 + fVar130 * 0.0 + fVar138 * 0.0;
                      fVar137 = fVar101 * 1.0 + fVar129 * 0.0 + fVar135 * 0.0;
                      fVar139 = fVar101 * 0.0 + fVar129 * 1.0 + fVar135 * 0.0;
                      fVar124 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 1.0;
                      fVar109 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 0.0;
                      fVar129 = fVar90 * 1.0 + fVar76 * 0.0 + fVar103 * 0.0;
                      fVar135 = fVar90 * 0.0 + fVar76 * 1.0 + fVar103 * 0.0;
                      fVar89 = fVar90 * 0.0 + fVar76 * 0.0 + fVar103 * 1.0;
                      fVar92 = fVar90 * 0.0 + fVar76 * 0.0 + fVar103 * 0.0;
                      local_178 = aVar9.y;
                      fStack_174 = aVar9.z;
                      local_188 = aVar9.x;
                      fVar121 = local_188 * fVar110 + fVar137 * 0.0 + fVar129 * 0.0;
                      fVar123 = local_188 * fVar112 + fVar139 * 0.0 + fVar135 * 0.0;
                      fVar125 = local_188 * fVar115 + fVar124 * 0.0 + fVar89 * 0.0;
                      fVar126 = local_188 * fVar117 + fVar109 * 0.0 + fVar92 * 0.0;
                      fVar130 = fVar113 * fVar110 + fVar122 * fVar137 + fVar129 * 0.0;
                      fVar138 = fVar113 * fVar112 + fVar122 * fVar139 + fVar135 * 0.0;
                      fVar91 = fVar113 * fVar115 + fVar122 * fVar124 + fVar89 * 0.0;
                      fVar93 = fVar113 * fVar117 + fVar122 * fVar109 + fVar92 * 0.0;
                      local_128 = fVar104 * fVar110 + fVar106 * fVar137 + fVar100 * fVar129;
                      fStack_124 = fVar104 * fVar112 + fVar106 * fVar139 + fVar100 * fVar135;
                      fStack_120 = fVar104 * fVar115 + fVar106 * fVar124 + fVar100 * fVar89;
                      fStack_11c = fVar104 * fVar117 + fVar106 * fVar109 + fVar100 * fVar92;
                      fVar76 = *(float *)(lVar16 + 0xc + lVar68);
                      fVar103 = *(float *)(lVar16 + -0x24 + lVar68);
                      fVar127 = *(float *)(lVar16 + -0x14 + lVar68);
                      fVar128 = *(float *)(lVar16 + -4 + lVar68);
                      fVar107 = fVar103 * fVar127 + fVar76 * fVar128;
                      fVar101 = fVar103 * fVar127 - fVar76 * fVar128;
                      fVar119 = fVar76 * fVar76 + fVar103 * fVar103 + -fVar127 * fVar127 +
                                -fVar128 * fVar128;
                      fVar122 = fVar76 * fVar76 - fVar103 * fVar103;
                      fVar98 = fVar127 * fVar127 + fVar122 + -fVar128 * fVar128;
                      fVar96 = fVar103 * fVar128 - fVar76 * fVar127;
                      fVar97 = fVar76 * fVar127 + fVar103 * fVar128;
                      fVar102 = fVar127 * fVar128 + fVar76 * fVar103;
                      fVar90 = fVar127 * fVar128 - fVar76 * fVar103;
                      pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                      fVar76 = *pfVar3;
                      pfVar4 = (float *)(lVar16 + -0x20 + lVar68);
                      fVar103 = *pfVar4;
                      fVar113 = pfVar4[1];
                      fVar136 = fVar128 * fVar128 + fVar122 + -fVar127 * fVar127;
                      pfVar5 = (float *)(lVar16 + -0x10 + lVar68);
                      fVar127 = *pfVar5;
                      fVar128 = pfVar5[1];
                      fVar122 = pfVar5[2];
                      fVar107 = fVar107 + fVar107;
                      fVar96 = fVar96 + fVar96;
                      pfVar5 = (float *)(lVar16 + lVar68);
                      fVar104 = *pfVar5;
                      fVar106 = pfVar5[1];
                      fVar100 = pfVar5[2];
                      fVar94 = fVar119 * 1.0 + fVar107 * 0.0 + fVar96 * 0.0;
                      fVar95 = fVar119 * 0.0 + fVar107 * 1.0 + fVar96 * 0.0;
                      fVar96 = fVar119 * 0.0 + fVar107 * 0.0 + fVar96 * 1.0;
                      fVar101 = fVar101 + fVar101;
                      fVar102 = fVar102 + fVar102;
                      fVar97 = fVar97 + fVar97;
                      fVar90 = fVar90 + fVar90;
                      fVar119 = fVar101 * 1.0 + fVar98 * 0.0 + fVar102 * 0.0;
                      fVar107 = fVar101 * 0.0 + fVar98 * 1.0 + fVar102 * 0.0;
                      fVar101 = fVar101 * 0.0 + fVar98 * 0.0 + fVar102 * 1.0;
                      fVar98 = fVar97 * 1.0 + fVar90 * 0.0 + fVar136 * 0.0;
                      fVar102 = fVar97 * 0.0 + fVar90 * 1.0 + fVar136 * 0.0;
                      fVar90 = fVar97 * 0.0 + fVar90 * 0.0 + fVar136 * 1.0;
                      fVar111 = fVar76 * fVar94 + fVar119 * 0.0 + fVar98 * 0.0;
                      fVar114 = fVar76 * fVar95 + fVar107 * 0.0 + fVar102 * 0.0;
                      fVar76 = fVar76 * fVar96 + fVar101 * 0.0 + fVar90 * 0.0;
                      fVar97 = fVar103 * fVar94 + fVar113 * fVar119 + fVar98 * 0.0;
                      fVar136 = fVar103 * fVar95 + fVar113 * fVar107 + fVar102 * 0.0;
                      fVar105 = fVar103 * fVar96 + fVar113 * fVar101 + fVar90 * 0.0;
                      fVar118 = fVar127 * fVar94 + fVar128 * fVar119 + fVar122 * fVar98;
                      fVar120 = fVar127 * fVar95 + fVar128 * fVar107 + fVar122 * fVar102;
                      fVar128 = fVar127 * fVar96 + fVar128 * fVar101 + fVar122 * fVar90;
                      fVar127 = fVar104 * fVar94 + fVar106 * fVar119 + fVar100 * fVar98 +
                                pfVar3[1] + 0.0;
                      fVar94 = fVar104 * fVar95 + fVar106 * fVar107 + fVar100 * fVar102 +
                               pfVar3[2] + 0.0;
                      fVar95 = fVar104 * fVar96 + fVar106 * fVar101 + fVar100 * fVar90 +
                               pfVar4[2] + 0.0;
                      fVar101 = fVar111 * fVar121 + fVar114 * fVar130 + fVar76 * local_128;
                      local_188 = fVar111 * fVar123 + fVar114 * fVar138 + fVar76 * fStack_124;
                      fVar103 = fVar111 * fVar125 + fVar114 * fVar91 + fVar76 * fStack_120;
                      fVar119 = fVar97 * fVar125 + fVar136 * fVar91 + fVar105 * fStack_120;
                      fVar113 = fVar97 * fVar126 + fVar136 * fVar93 + fVar105 * fStack_11c;
                      fVar122 = fVar118 * fVar121 + fVar120 * fVar130 + fVar128 * local_128;
                      fVar104 = fVar118 * fVar123 + fVar120 * fVar138 + fVar128 * fStack_124;
                      fVar107 = fVar118 * fVar125 + fVar120 * fVar91 + fVar128 * fStack_120;
                      psVar67 = extraout_RDX_12;
                      fVar106 = fVar118 * fVar126 + fVar120 * fVar93 + fVar128 * fStack_11c;
                      fVar76 = fVar111 * fVar126 + fVar114 * fVar93 + fVar76 * fStack_11c;
                      fVar128 = fVar127 * fVar121 + fVar94 * fVar130 + fVar95 * local_128 +
                                fVar108 * fVar110 + fVar116 * fVar137 + fVar99 * fVar129 +
                                local_178 + 0.0;
                      fVar100 = fVar127 * fVar123 + fVar94 * fVar138 + fVar95 * fStack_124 +
                                fVar108 * fVar112 + fVar116 * fVar139 + fVar99 * fVar135 +
                                fStack_174 + 0.0;
                      fVar90 = fVar127 * fVar125 + fVar94 * fVar91 + fVar95 * fStack_120 +
                               fVar108 * fVar115 + fVar116 * fVar124 + fVar99 * fVar89 +
                               (pAVar15->l).vy.field_0.m128[2] + 0.0;
                      fVar108 = fVar127 * fVar126 + fVar94 * fVar93 + fVar95 * fStack_11c +
                                fVar108 * fVar117 + fVar116 * fVar109 + fVar99 * fVar92 + 0.0;
                      fVar127 = fVar97 * fVar121 + fVar136 * fVar130 + fVar105 * local_128;
                      fVar116 = fVar97 * fVar123 + fVar136 * fVar138 + fVar105 * fStack_124;
                    }
                  }
                  else {
                    auVar29._4_4_ = -(uint)((pAVar15->l).vy.field_0.m128[0] != 0.0);
                    auVar29._0_4_ = -(uint)((pAVar15->l).vx.field_0.m128[3] != 0.0);
                    auVar29._8_4_ = -(uint)((pAVar15->l).vy.field_0.m128[1] != 1.0);
                    auVar29._12_4_ = -(uint)((pAVar15->l).vy.field_0.m128[2] != 0.0);
                    uVar72 = movmskps(uVar72,auVar29);
                    if ((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                       (((uVar72 & 4) != 0 ||
                        (bVar66 = ((byte)uVar72 & 8) >> 3,
                        uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66), bVar66 != 0))))
                    goto LAB_0016a0e1;
                    auVar30._4_4_ = -(uint)((pAVar15->l).vz.field_0.m128[0] != 0.0);
                    auVar30._0_4_ = -(uint)((pAVar15->l).vy.field_0.m128[3] != 0.0);
                    auVar30._8_4_ = -(uint)((pAVar15->l).vz.field_0.m128[1] != 0.0);
                    auVar30._12_4_ = -(uint)((pAVar15->l).vz.field_0.m128[2] != 1.0);
                    uVar72 = movmskps(uVar72,auVar30);
                    if (((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                        ((uVar72 & 4) != 0)) ||
                       (bVar66 = ((byte)uVar72 & 8) >> 3,
                       uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66), bVar66 != 0))
                    goto LAB_0016a0e1;
                    auVar31._4_4_ = -(uint)((pAVar15->p).field_0.m128[0] != 0.0);
                    auVar31._0_4_ = -(uint)((pAVar15->l).vz.field_0.m128[3] != 0.0);
                    auVar31._8_4_ = -(uint)((pAVar15->p).field_0.m128[1] != 0.0);
                    auVar31._12_4_ = -(uint)((pAVar15->p).field_0.m128[2] != 0.0);
                    uVar72 = movmskps(uVar72,auVar31);
                    if ((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                       ((uVar72 & 4) != 0)) goto LAB_0016a0e1;
                    bVar66 = ((byte)uVar72 & 8) >> 3;
                    uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                    psVar67 = (size_t *)(ulong)uVar72;
                    if ((bVar66 != 0) ||
                       ((bVar11 != 0 &&
                        ((fVar76 = (pAVar15->p).field_0.m128[3], fVar76 != 1.0 || (NAN(fVar76)))))))
                    goto LAB_0016a0e1;
                    pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                    fVar101 = *pfVar3;
                    local_188 = pfVar3[1];
                    fVar103 = pfVar3[2];
                    fVar76 = pfVar3[3];
                    pfVar3 = (float *)(lVar16 + -0x20 + lVar68);
                    fVar127 = *pfVar3;
                    fVar116 = pfVar3[1];
                    fVar119 = pfVar3[2];
                    fVar113 = pfVar3[3];
                    pfVar3 = (float *)(lVar16 + -0x10 + lVar68);
                    fVar122 = *pfVar3;
                    fVar104 = pfVar3[1];
                    fVar107 = pfVar3[2];
                    fVar106 = pfVar3[3];
                    pfVar3 = (float *)(lVar16 + lVar68);
                    fVar128 = *pfVar3;
                    fVar100 = pfVar3[1];
                    fVar90 = pfVar3[2];
                    fVar108 = pfVar3[3];
                    local_158.quaternion = (bool)bVar12;
                  }
LAB_0016abd7:
                  pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x30);
                  *pfVar3 = fVar101;
                  pfVar3[1] = local_188;
                  pfVar3[2] = fVar103;
                  pfVar3[3] = fVar76;
                  pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x20);
                  *pfVar3 = fVar127;
                  pfVar3[1] = fVar116;
                  pfVar3[2] = fVar119;
                  pfVar3[3] = fVar113;
                  pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x10);
                  *pfVar3 = fVar122;
                  pfVar3[1] = fVar104;
                  pfVar3[2] = fVar107;
                  pfVar3[3] = fVar106;
                  pfVar3 = (float *)((long)&((local_158.spaces.items)->l).vx.field_0 + lVar68);
                  *pfVar3 = fVar128;
                  pfVar3[1] = fVar100;
                  pfVar3[2] = fVar90;
                  pfVar3[3] = fVar108;
                  uVar70 = uVar70 + 1;
                  lVar68 = lVar68 + 0x40;
                  pAVar61 = local_158.spaces.items;
                } while (uVar70 < (ulong)puVar69[2]);
              }
            }
            else {
              uVar65 = (undefined7)((ulong)pLVar2 >> 8);
              if (puVar69[2] == 1) {
                uVar8 = *(undefined8 *)&(pLVar2->vx).field_0;
                fVar76 = (float)uVar8;
                fVar103 = (float)((ulong)uVar8 >> 0x20);
                fVar127 = (float)*puVar69;
                fVar128 = (float)((ulong)*puVar69 >> 0x20);
                uVar72 = -(uint)(fVar76 < fVar127);
                uVar74 = -(uint)(fVar103 < fVar128);
                local_158.time_range.upper =
                     (float)(~uVar74 & (uint)fVar128 | (uint)fVar103 & uVar74);
                local_158.time_range.lower =
                     (float)(~uVar72 & (uint)fVar76 | (uint)fVar127 & uVar72);
                local_158.spaces.size_active = 0;
                local_158.spaces.size_alloced = 0;
                local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
                if (sVar14 != 0) {
                  local_158.spaces.items =
                       (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                       alignedMalloc(sVar14 << 6,0x10);
                  psVar67 = extraout_RDX_15;
                  local_158.spaces.size_alloced = sVar14;
                }
                local_158.quaternion = true;
                if (*(undefined1 *)((long)&(pLVar2->vz).field_0 + 8) == '\0') {
                  local_158.quaternion = SUB41(*(undefined4 *)(puVar69 + 5),0);
                }
                local_158.spaces.size_active = local_158.spaces.size_alloced;
                if (*(size_t *)&(pLVar2->vy).field_0 != 0) {
                  lVar68 = 0x30;
                  uVar70 = 0;
                  do {
                    uVar72 = (uint)psVar67;
                    pAVar61 = *(AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **)
                               &(pLVar2->vz).field_0;
                    pfVar3 = (float *)puVar69[4];
                    bVar11 = *(undefined1 *)((long)&(pLVar2->vz).field_0 + 8);
                    bVar12 = *(byte *)(puVar69 + 5);
                    local_158.quaternion = false;
                    fVar76 = *(float *)((long)pAVar61 + lVar68 + -0x30);
                    uVar8 = *(undefined8 *)((long)pAVar61 + lVar68 + -0x2c);
                    fVar103 = (float)((ulong)uVar8 >> 0x20);
                    local_188 = (float)uVar8;
                    if ((((fVar76 != 1.0) || (NAN(fVar76))) || (local_188 != 0.0)) ||
                       (((NAN(local_188) || (fVar103 != 0.0)) || (NAN(fVar103))))) {
LAB_0016aded:
                      fVar127 = (float)*(undefined8 *)pfVar3;
                      fVar128 = (float)((ulong)*(undefined8 *)pfVar3 >> 0x20);
                      iVar73 = -(uint)(fVar127 != 1.0);
                      iVar75 = -(uint)(fVar128 != 0.0);
                      auVar86._4_4_ = iVar75;
                      auVar86._0_4_ = iVar73;
                      auVar86._8_4_ = iVar75;
                      auVar86._12_4_ = iVar75;
                      auVar85._8_8_ = auVar86._8_8_;
                      auVar85._4_4_ = iVar73;
                      auVar85._0_4_ = iVar73;
                      uVar72 = movmskpd(uVar72,auVar85);
                      psVar67 = (size_t *)(ulong)uVar72;
                      fVar76 = pfVar3[2];
                      if ((uVar72 & 1) == 0) {
                        bVar66 = (byte)uVar72 >> 1;
                        uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                        psVar67 = (size_t *)(ulong)uVar72;
                        if (((bVar66 == 0) && (fVar76 == 0.0)) && (!NAN(fVar76))) {
                          auVar53._4_4_ = -(uint)(pfVar3[4] != 0.0);
                          auVar53._0_4_ = -(uint)(pfVar3[3] != 0.0);
                          auVar53._8_4_ = -(uint)(pfVar3[5] != 1.0);
                          auVar53._12_4_ = -(uint)(pfVar3[6] != 0.0);
                          uVar72 = movmskps(uVar72,auVar53);
                          psVar67 = (size_t *)(ulong)uVar72;
                          if ((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                             ((uVar72 & 4) == 0)) {
                            bVar66 = ((byte)uVar72 & 8) >> 3;
                            uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                            psVar67 = (size_t *)(ulong)uVar72;
                            if (bVar66 == 0) {
                              auVar54._4_4_ = -(uint)(pfVar3[8] != 0.0);
                              auVar54._0_4_ = -(uint)(pfVar3[7] != 0.0);
                              auVar54._8_4_ = -(uint)(pfVar3[9] != 0.0);
                              auVar54._12_4_ = -(uint)(pfVar3[10] != 1.0);
                              uVar72 = movmskps(uVar72,auVar54);
                              psVar67 = (size_t *)(ulong)uVar72;
                              if ((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                                 ((uVar72 & 4) == 0)) {
                                bVar66 = ((byte)uVar72 & 8) >> 3;
                                uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                                psVar67 = (size_t *)(ulong)uVar72;
                                if (bVar66 == 0) {
                                  auVar55._4_4_ = -(uint)(pfVar3[0xc] != 0.0);
                                  auVar55._0_4_ = -(uint)(pfVar3[0xb] != 0.0);
                                  auVar55._8_4_ = -(uint)(pfVar3[0xd] != 0.0);
                                  auVar55._12_4_ = -(uint)(pfVar3[0xe] != 0.0);
                                  uVar72 = movmskps(uVar72,auVar55);
                                  psVar67 = (size_t *)(ulong)uVar72;
                                  if ((((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                                       ((uVar72 & 4) == 0)) &&
                                      (bVar66 = ((byte)uVar72 & 8) >> 3,
                                      psVar67 = (size_t *)
                                                (ulong)CONCAT31((int3)(uVar72 >> 8),bVar66),
                                      bVar66 == 0)) &&
                                     ((bVar12 == 0 || ((pfVar3[0xf] == 1.0 && (!NAN(pfVar3[0xf])))))
                                     )) {
                                    pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x30);
                                    fVar101 = *pfVar3;
                                    local_188 = pfVar3[1];
                                    fVar103 = pfVar3[2];
                                    fVar76 = pfVar3[3];
                                    pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x20);
                                    fVar127 = *pfVar3;
                                    fVar116 = pfVar3[1];
                                    fVar119 = pfVar3[2];
                                    fVar113 = pfVar3[3];
                                    pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x10);
                                    fVar122 = *pfVar3;
                                    fVar104 = pfVar3[1];
                                    fVar107 = pfVar3[2];
                                    fVar106 = pfVar3[3];
                                    pfVar3 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar68);
                                    fVar128 = *pfVar3;
                                    fVar100 = pfVar3[1];
                                    fVar90 = pfVar3[2];
                                    fVar108 = pfVar3[3];
                                    local_158.quaternion = (bool)bVar11;
                                    goto LAB_0016b8a5;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      if ((bVar11 == 0) && (bVar12 == 0)) {
                        pfVar4 = (float *)((long)pAVar61 + lVar68 + -0x30);
                        fVar138 = *pfVar4;
                        fVar89 = pfVar4[1];
                        fVar91 = pfVar4[2];
                        fVar92 = pfVar4[3];
                        pfVar4 = (float *)((long)pAVar61 + lVar68 + -0x20);
                        fVar93 = *pfVar4;
                        fVar94 = pfVar4[1];
                        fVar95 = pfVar4[2];
                        fVar96 = pfVar4[3];
                        pfVar4 = (float *)((long)pAVar61 + lVar68 + -0x10);
                        fVar97 = *pfVar4;
                        fVar98 = pfVar4[1];
                        fVar102 = pfVar4[2];
                        fVar136 = pfVar4[3];
                        fVar101 = fVar127 * fVar138 + fVar128 * fVar93 + fVar76 * fVar97;
                        local_188 = fVar127 * fVar89 + fVar128 * fVar94 + fVar76 * fVar98;
                        fVar103 = fVar127 * fVar91 + fVar128 * fVar95 + fVar76 * fVar102;
                        fVar116 = pfVar3[4];
                        fVar99 = pfVar3[5];
                        fVar129 = pfVar3[6];
                        fVar106 = pfVar3[8];
                        fVar119 = fVar116 * fVar91 + fVar99 * fVar95 + fVar129 * fVar102;
                        fVar113 = fVar116 * fVar92 + fVar99 * fVar96 + fVar129 * fVar136;
                        fVar100 = pfVar3[9];
                        fVar90 = pfVar3[10];
                        fVar122 = fVar106 * fVar138 + fVar100 * fVar93 + fVar90 * fVar97;
                        fVar104 = fVar106 * fVar89 + fVar100 * fVar94 + fVar90 * fVar98;
                        fVar107 = fVar106 * fVar91 + fVar100 * fVar95 + fVar90 * fVar102;
                        fVar108 = pfVar3[0xc];
                        fVar130 = pfVar3[0xd];
                        fVar135 = pfVar3[0xe];
                        pfVar3 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar68);
                        fVar106 = fVar106 * fVar92 + fVar100 * fVar96 + fVar90 * fVar136;
                        fVar76 = fVar127 * fVar92 + fVar128 * fVar96 + fVar76 * fVar136;
                        fVar128 = fVar108 * fVar138 + fVar130 * fVar93 + fVar135 * fVar97 + *pfVar3;
                        fVar100 = fVar108 * fVar89 + fVar130 * fVar94 + fVar135 * fVar98 + pfVar3[1]
                        ;
                        fVar90 = fVar108 * fVar91 + fVar130 * fVar95 + fVar135 * fVar102 + pfVar3[2]
                        ;
                        fVar108 = fVar108 * fVar92 + fVar130 * fVar96 + fVar135 * fVar136 +
                                  pfVar3[3];
                        fVar127 = fVar116 * fVar138 + fVar99 * fVar93 + fVar129 * fVar97;
                        fVar116 = fVar116 * fVar89 + fVar99 * fVar94 + fVar129 * fVar98;
                      }
                      else if ((bVar11 == 0) || (bVar12 == 0)) {
                        if ((bVar11 == 0) || (bVar12 != 0)) {
                          if ((local_188 != 0.0) ||
                             ((((NAN(local_188) || (fVar103 != 0.0)) || (NAN(fVar103))) ||
                              (uVar8 = *(undefined8 *)((long)pAVar61 + lVar68 + -0x10),
                              auVar36._4_4_ =
                                   -(uint)(*(float *)((long)pAVar61 + lVar68 + -0x20) != 0.0),
                              auVar36._0_4_ =
                                   -(uint)(*(float *)((long)pAVar61 + lVar68 + -0x18) != 0.0),
                              auVar36._8_4_ = -(uint)((float)uVar8 != 0.0),
                              auVar36._12_4_ = -(uint)((float)((ulong)uVar8 >> 0x20) != 0.0),
                              uVar59 = movmskps((int)CONCAT71(uVar65,bVar12),auVar36),
                              (char)uVar59 != '\0')))) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                       ,0x83);
                            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                            std::ostream::put(-0x30);
                            std::ostream::flush();
                            psVar67 = extraout_RDX_18;
                          }
                          fVar76 = pfVar3[3];
                          fVar127 = pfVar3[4];
                          fVar113 = pfVar3[7];
                          fVar122 = pfVar3[8];
                          fVar104 = pfVar3[9];
                          fVar106 = pfVar3[0xb];
                          fVar128 = pfVar3[0xc];
                          fVar100 = pfVar3[0xd];
                          fVar90 = pfVar3[0xe];
                          fVar108 = pfVar3[0xf];
                          uVar8 = *(undefined8 *)((long)&(pAVar61->l).vx.field_0 + lVar68);
                          fVar101 = *(float *)((long)pAVar61 + lVar68 + -0x30) * *pfVar3;
                          local_188 = pfVar3[1] + (float)uVar8;
                          fVar103 = pfVar3[2] + (float)((ulong)uVar8 >> 0x20);
                          fVar119 = pfVar3[6] +
                                    *(float *)((long)&(pAVar61->l).vx.field_0 + lVar68 + 8);
                          fVar116 = pfVar3[5] * *(float *)((long)pAVar61 + lVar68 + -0x1c);
                          fVar107 = pfVar3[10] * *(float *)((long)pAVar61 + lVar68 + -8);
                          local_158.quaternion = true;
                        }
                        else {
                          local_e8 = ZEXT416(*(uint *)((long)&(pAVar61->l).vx.field_0 + lVar68 + 0xc
                                                      ));
                          local_c8 = ZEXT416(*(uint *)((long)pAVar61 + lVar68 + -0x24));
                          _local_f8 = ZEXT416(*(uint *)((long)pAVar61 + lVar68 + -4));
                          pfVar4 = (float *)((long)pAVar61 + lVar68 + -0x20);
                          local_108 = *pfVar4;
                          fStack_104 = pfVar4[1];
                          fStack_fc = pfVar4[3];
                          pfVar4 = (float *)((long)pAVar61 + lVar68 + -0x10);
                          fVar76 = *pfVar4;
                          fVar127 = pfVar4[1];
                          local_118 = *(undefined8 *)pfVar4;
                          fVar128 = pfVar4[2];
                          uStack_110 = *(undefined8 *)(pfVar4 + 2);
                          local_d8._8_8_ = 0;
                          local_d8._0_8_ = *(ulong *)((long)pAVar61 + lVar68 + -0x18);
                          pfVar5 = (float *)((long)pAVar61 + lVar68 + -0x30);
                          local_a8 = *pfVar5;
                          fStack_9c = pfVar5[1];
                          fVar113 = *pfVar3;
                          fVar122 = pfVar3[1];
                          fVar104 = pfVar3[2];
                          fVar106 = pfVar3[4];
                          fVar100 = pfVar3[5];
                          fVar90 = pfVar3[6];
                          local_88 = *(ulong *)(pfVar3 + 8);
                          uStack_80 = *(ulong *)(pfVar3 + 10);
                          fVar108 = pfVar3[0xc];
                          fVar116 = pfVar3[0xd];
                          fVar119 = pfVar3[0xe];
                          fVar101 = fVar113 * local_a8 + fVar122 * local_108 + fVar104 * fVar76;
                          fVar107 = fVar113 * 0.0 + fVar122 * fStack_104 + fVar104 * fVar127;
                          fVar113 = fVar113 * 0.0 + fVar122 * 0.0 + fVar104 * fVar128;
                          local_128 = fVar106 * local_a8 + fVar100 * local_108 + fVar90 * fVar76;
                          fStack_124 = fVar106 * 0.0 + fVar100 * fStack_104 + fVar90 * fVar127;
                          fStack_120 = fVar106 * 0.0 + fVar100 * 0.0 + fVar90 * fVar128;
                          fStack_11c = fVar106 * fStack_9c +
                                       fVar100 * fStack_fc + fVar90 * pfVar4[3];
                          fStack_100 = 0.0;
                          fStack_a4 = 0.0;
                          fStack_a0 = 0.0;
                          pfVar3 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar68);
                          local_b8._4_4_ =
                               fVar108 * 0.0 + fVar116 * fStack_104 + fVar119 * fVar127 + pfVar3[1];
                          local_b8._0_4_ =
                               fVar108 * local_a8 + fVar116 * local_108 + fVar119 * fVar76 + *pfVar3
                          ;
                          fStack_b0 = fVar108 * 0.0 + fVar116 * 0.0 + fVar119 * fVar128 + pfVar3[2];
                          fStack_ac = fVar108 * fStack_9c +
                                      fVar116 * fStack_fc + fVar119 * pfVar4[3] + pfVar3[3];
                          if ((((fVar107 != 0.0) || (NAN(fVar107))) ||
                              ((fVar113 != 0.0 || ((NAN(fVar113) || (fStack_120 != 0.0)))))) ||
                             (NAN(fStack_120))) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                       ,0x61);
                            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                            std::ostream::put(-0x30);
                            std::ostream::flush();
                            psVar67 = extraout_RDX_17;
                          }
                          fVar122 = local_a8 * (float)local_88 +
                                    local_108 * local_88._4_4_ + (float)local_118 * (float)uStack_80
                          ;
                          fVar104 = fStack_a4 * (float)local_88 +
                                    fStack_104 * local_88._4_4_ + local_118._4_4_ * (float)uStack_80
                          ;
                          fVar107 = fStack_a0 * (float)local_88 +
                                    fStack_100 * local_88._4_4_ +
                                    (float)uStack_110 * (float)uStack_80;
                          local_158.quaternion = true;
                          fVar119 = local_d8._0_4_;
                          fVar113 = local_d8._4_4_;
                          fVar106 = (float)local_f8._0_4_;
                          fVar76 = (float)local_c8._0_4_;
                          fVar128 = (float)local_b8._0_4_;
                          fVar100 = (float)local_b8._4_4_;
                          fVar90 = fStack_b0;
                          fVar108 = (float)local_e8._0_4_;
                          fVar127 = local_128;
                          fVar116 = fStack_124;
                        }
                      }
                      else {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                   ,0x67);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                        std::ostream::put(-0x30);
                        std::ostream::flush();
                        fVar76 = *(float *)((long)&(pAVar61->l).vx.field_0 + lVar68 + 0xc);
                        fVar103 = *(float *)((long)pAVar61 + lVar68 + -0x24);
                        fVar127 = *(float *)((long)pAVar61 + lVar68 + -0x14);
                        fVar128 = *(float *)((long)pAVar61 + lVar68 + -4);
                        auVar10 = *(undefined1 (*) [16])((long)pAVar61 + lVar68 + -0x30);
                        pfVar5 = (float *)((long)pAVar61 + lVar68 + -0x20);
                        fVar113 = *pfVar5;
                        fVar122 = pfVar5[1];
                        pfVar4 = (float *)((long)pAVar61 + lVar68 + -0x10);
                        fVar104 = *pfVar4;
                        fVar106 = pfVar4[1];
                        fVar100 = pfVar4[2];
                        fVar130 = fVar103 * fVar127 + fVar76 * fVar128;
                        fVar101 = fVar103 * fVar127 - fVar76 * fVar128;
                        fVar119 = fVar76 * fVar76 + fVar103 * fVar103 + -fVar127 * fVar127 +
                                  -fVar128 * fVar128;
                        fVar107 = fVar76 * fVar76 - fVar103 * fVar103;
                        fVar129 = fVar127 * fVar127 + fVar107 + -fVar128 * fVar128;
                        fVar138 = fVar103 * fVar128 - fVar76 * fVar127;
                        fVar90 = fVar76 * fVar127 + fVar103 * fVar128;
                        fVar135 = fVar127 * fVar128 + fVar76 * fVar103;
                        fVar76 = fVar127 * fVar128 - fVar76 * fVar103;
                        pfVar4 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar68);
                        fVar108 = *pfVar4;
                        fVar116 = pfVar4[1];
                        fVar99 = pfVar4[2];
                        fVar130 = fVar130 + fVar130;
                        fVar138 = fVar138 + fVar138;
                        fVar101 = fVar101 + fVar101;
                        fVar135 = fVar135 + fVar135;
                        fVar90 = fVar90 + fVar90;
                        fVar76 = fVar76 + fVar76;
                        fVar103 = fVar128 * fVar128 + fVar107 + -fVar127 * fVar127;
                        fVar110 = fVar119 * 1.0 + fVar130 * 0.0 + fVar138 * 0.0;
                        fVar112 = fVar119 * 0.0 + fVar130 * 1.0 + fVar138 * 0.0;
                        fVar115 = fVar119 * 0.0 + fVar130 * 0.0 + fVar138 * 1.0;
                        fVar117 = fVar119 * 0.0 + fVar130 * 0.0 + fVar138 * 0.0;
                        fVar137 = fVar101 * 1.0 + fVar129 * 0.0 + fVar135 * 0.0;
                        fVar139 = fVar101 * 0.0 + fVar129 * 1.0 + fVar135 * 0.0;
                        fVar124 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 1.0;
                        fVar109 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 0.0;
                        fVar129 = fVar90 * 1.0 + fVar76 * 0.0 + fVar103 * 0.0;
                        fVar135 = fVar90 * 0.0 + fVar76 * 1.0 + fVar103 * 0.0;
                        fVar89 = fVar90 * 0.0 + fVar76 * 0.0 + fVar103 * 1.0;
                        fVar92 = fVar90 * 0.0 + fVar76 * 0.0 + fVar103 * 0.0;
                        local_178 = auVar10._4_4_;
                        fStack_174 = auVar10._8_4_;
                        local_188 = auVar10._0_4_;
                        fVar121 = local_188 * fVar110 + fVar137 * 0.0 + fVar129 * 0.0;
                        fVar123 = local_188 * fVar112 + fVar139 * 0.0 + fVar135 * 0.0;
                        fVar125 = local_188 * fVar115 + fVar124 * 0.0 + fVar89 * 0.0;
                        fVar126 = local_188 * fVar117 + fVar109 * 0.0 + fVar92 * 0.0;
                        fVar130 = fVar113 * fVar110 + fVar122 * fVar137 + fVar129 * 0.0;
                        fVar138 = fVar113 * fVar112 + fVar122 * fVar139 + fVar135 * 0.0;
                        fVar91 = fVar113 * fVar115 + fVar122 * fVar124 + fVar89 * 0.0;
                        fVar93 = fVar113 * fVar117 + fVar122 * fVar109 + fVar92 * 0.0;
                        local_128 = fVar104 * fVar110 + fVar106 * fVar137 + fVar100 * fVar129;
                        fStack_124 = fVar104 * fVar112 + fVar106 * fVar139 + fVar100 * fVar135;
                        fStack_120 = fVar104 * fVar115 + fVar106 * fVar124 + fVar100 * fVar89;
                        fStack_11c = fVar104 * fVar117 + fVar106 * fVar109 + fVar100 * fVar92;
                        fVar76 = pfVar3[0xf];
                        fVar103 = pfVar3[3];
                        fVar127 = pfVar3[7];
                        fVar128 = pfVar3[0xb];
                        fVar107 = fVar103 * fVar127 + fVar76 * fVar128;
                        fVar101 = fVar103 * fVar127 - fVar76 * fVar128;
                        fVar119 = fVar76 * fVar76 + fVar103 * fVar103 + -fVar127 * fVar127 +
                                  -fVar128 * fVar128;
                        fVar122 = fVar76 * fVar76 - fVar103 * fVar103;
                        fVar98 = fVar127 * fVar127 + fVar122 + -fVar128 * fVar128;
                        fVar96 = fVar103 * fVar128 - fVar76 * fVar127;
                        fVar97 = fVar76 * fVar127 + fVar103 * fVar128;
                        fVar102 = fVar127 * fVar128 + fVar76 * fVar103;
                        fVar90 = fVar127 * fVar128 - fVar76 * fVar103;
                        fVar76 = *pfVar3;
                        fVar103 = pfVar3[4];
                        fVar113 = pfVar3[5];
                        fVar136 = fVar128 * fVar128 + fVar122 + -fVar127 * fVar127;
                        fVar127 = pfVar3[8];
                        fVar128 = pfVar3[9];
                        fVar122 = pfVar3[10];
                        fVar107 = fVar107 + fVar107;
                        fVar96 = fVar96 + fVar96;
                        fVar104 = pfVar3[0xc];
                        fVar106 = pfVar3[0xd];
                        fVar100 = pfVar3[0xe];
                        fVar94 = fVar119 * 1.0 + fVar107 * 0.0 + fVar96 * 0.0;
                        fVar95 = fVar119 * 0.0 + fVar107 * 1.0 + fVar96 * 0.0;
                        fVar96 = fVar119 * 0.0 + fVar107 * 0.0 + fVar96 * 1.0;
                        fVar101 = fVar101 + fVar101;
                        fVar102 = fVar102 + fVar102;
                        fVar97 = fVar97 + fVar97;
                        fVar90 = fVar90 + fVar90;
                        fVar119 = fVar101 * 1.0 + fVar98 * 0.0 + fVar102 * 0.0;
                        fVar107 = fVar101 * 0.0 + fVar98 * 1.0 + fVar102 * 0.0;
                        fVar101 = fVar101 * 0.0 + fVar98 * 0.0 + fVar102 * 1.0;
                        fVar98 = fVar97 * 1.0 + fVar90 * 0.0 + fVar136 * 0.0;
                        fVar102 = fVar97 * 0.0 + fVar90 * 1.0 + fVar136 * 0.0;
                        fVar90 = fVar97 * 0.0 + fVar90 * 0.0 + fVar136 * 1.0;
                        fVar111 = fVar76 * fVar94 + fVar119 * 0.0 + fVar98 * 0.0;
                        fVar114 = fVar76 * fVar95 + fVar107 * 0.0 + fVar102 * 0.0;
                        fVar76 = fVar76 * fVar96 + fVar101 * 0.0 + fVar90 * 0.0;
                        fVar97 = fVar103 * fVar94 + fVar113 * fVar119 + fVar98 * 0.0;
                        fVar136 = fVar103 * fVar95 + fVar113 * fVar107 + fVar102 * 0.0;
                        fVar105 = fVar103 * fVar96 + fVar113 * fVar101 + fVar90 * 0.0;
                        fVar118 = fVar127 * fVar94 + fVar128 * fVar119 + fVar122 * fVar98;
                        fVar120 = fVar127 * fVar95 + fVar128 * fVar107 + fVar122 * fVar102;
                        fVar128 = fVar127 * fVar96 + fVar128 * fVar101 + fVar122 * fVar90;
                        fVar127 = fVar104 * fVar94 + fVar106 * fVar119 + fVar100 * fVar98 +
                                  pfVar3[1] + 0.0;
                        fVar94 = fVar104 * fVar95 + fVar106 * fVar107 + fVar100 * fVar102 +
                                 pfVar3[2] + 0.0;
                        fVar95 = fVar104 * fVar96 + fVar106 * fVar101 + fVar100 * fVar90 +
                                 pfVar3[6] + 0.0;
                        fVar101 = fVar111 * fVar121 + fVar114 * fVar130 + fVar76 * local_128;
                        local_188 = fVar111 * fVar123 + fVar114 * fVar138 + fVar76 * fStack_124;
                        fVar103 = fVar111 * fVar125 + fVar114 * fVar91 + fVar76 * fStack_120;
                        fVar119 = fVar97 * fVar125 + fVar136 * fVar91 + fVar105 * fStack_120;
                        fVar113 = fVar97 * fVar126 + fVar136 * fVar93 + fVar105 * fStack_11c;
                        fVar122 = fVar118 * fVar121 + fVar120 * fVar130 + fVar128 * local_128;
                        fVar104 = fVar118 * fVar123 + fVar120 * fVar138 + fVar128 * fStack_124;
                        fVar107 = fVar118 * fVar125 + fVar120 * fVar91 + fVar128 * fStack_120;
                        psVar67 = extraout_RDX_16;
                        fVar106 = fVar118 * fVar126 + fVar120 * fVar93 + fVar128 * fStack_11c;
                        fVar76 = fVar111 * fVar126 + fVar114 * fVar93 + fVar76 * fStack_11c;
                        fVar128 = fVar127 * fVar121 + fVar94 * fVar130 + fVar95 * local_128 +
                                  fVar108 * fVar110 + fVar116 * fVar137 + fVar99 * fVar129 +
                                  local_178 + 0.0;
                        fVar100 = fVar127 * fVar123 + fVar94 * fVar138 + fVar95 * fStack_124 +
                                  fVar108 * fVar112 + fVar116 * fVar139 + fVar99 * fVar135 +
                                  fStack_174 + 0.0;
                        fVar90 = fVar127 * fVar125 + fVar94 * fVar91 + fVar95 * fStack_120 +
                                 fVar108 * fVar115 + fVar116 * fVar124 + fVar99 * fVar89 +
                                 pfVar5[2] + 0.0;
                        fVar108 = fVar127 * fVar126 + fVar94 * fVar93 + fVar95 * fStack_11c +
                                  fVar108 * fVar117 + fVar116 * fVar109 + fVar99 * fVar92 + 0.0;
                        fVar127 = fVar97 * fVar121 + fVar136 * fVar130 + fVar105 * local_128;
                        fVar116 = fVar97 * fVar123 + fVar136 * fVar138 + fVar105 * fStack_124;
                      }
                    }
                    else {
                      pfVar4 = (float *)((long)pAVar61 + lVar68 + -0x24);
                      auVar33._4_4_ = -(uint)(pfVar4[1] != 0.0);
                      auVar33._0_4_ = -(uint)(*pfVar4 != 0.0);
                      auVar33._8_4_ = -(uint)(pfVar4[2] != 1.0);
                      auVar33._12_4_ = -(uint)(pfVar4[3] != 0.0);
                      uVar72 = movmskps(uVar72,auVar33);
                      if ((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                         (((uVar72 & 4) != 0 ||
                          (bVar66 = ((byte)uVar72 & 8) >> 3,
                          uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66), bVar66 != 0))))
                      goto LAB_0016aded;
                      pfVar4 = (float *)((long)pAVar61 + lVar68 + -0x14);
                      auVar34._4_4_ = -(uint)(pfVar4[1] != 0.0);
                      auVar34._0_4_ = -(uint)(*pfVar4 != 0.0);
                      auVar34._8_4_ = -(uint)(pfVar4[2] != 0.0);
                      auVar34._12_4_ = -(uint)(pfVar4[3] != 1.0);
                      uVar72 = movmskps(uVar72,auVar34);
                      if (((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                          ((uVar72 & 4) != 0)) ||
                         (bVar66 = ((byte)uVar72 & 8) >> 3,
                         uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66), bVar66 != 0))
                      goto LAB_0016aded;
                      pfVar4 = (float *)((long)pAVar61 + lVar68 + -4);
                      auVar35._4_4_ = -(uint)(pfVar4[1] != 0.0);
                      auVar35._0_4_ = -(uint)(*pfVar4 != 0.0);
                      auVar35._8_4_ = -(uint)(pfVar4[2] != 0.0);
                      auVar35._12_4_ = -(uint)(pfVar4[3] != 0.0);
                      uVar72 = movmskps(uVar72,auVar35);
                      if ((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                         ((uVar72 & 4) != 0)) goto LAB_0016aded;
                      bVar66 = ((byte)uVar72 & 8) >> 3;
                      uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                      psVar67 = (size_t *)(ulong)uVar72;
                      if ((bVar66 != 0) ||
                         ((bVar11 != 0 &&
                          ((fVar76 = *(float *)((long)&(pAVar61->l).vx.field_0 + lVar68 + 0xc),
                           fVar76 != 1.0 || (NAN(fVar76))))))) goto LAB_0016aded;
                      fVar101 = *pfVar3;
                      local_188 = pfVar3[1];
                      fVar103 = pfVar3[2];
                      fVar76 = pfVar3[3];
                      fVar127 = pfVar3[4];
                      fVar116 = pfVar3[5];
                      fVar119 = pfVar3[6];
                      fVar113 = pfVar3[7];
                      fVar122 = pfVar3[8];
                      fVar104 = pfVar3[9];
                      fVar107 = pfVar3[10];
                      fVar106 = pfVar3[0xb];
                      fVar128 = pfVar3[0xc];
                      fVar100 = pfVar3[0xd];
                      fVar90 = pfVar3[0xe];
                      fVar108 = pfVar3[0xf];
                      local_158.quaternion = (bool)bVar12;
                    }
LAB_0016b8a5:
                    pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x30);
                    *pfVar3 = fVar101;
                    pfVar3[1] = local_188;
                    pfVar3[2] = fVar103;
                    pfVar3[3] = fVar76;
                    pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x20);
                    *pfVar3 = fVar127;
                    pfVar3[1] = fVar116;
                    pfVar3[2] = fVar119;
                    pfVar3[3] = fVar113;
                    pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x10);
                    *pfVar3 = fVar122;
                    pfVar3[1] = fVar104;
                    pfVar3[2] = fVar107;
                    pfVar3[3] = fVar106;
                    pfVar3 = (float *)((long)&((local_158.spaces.items)->l).vx.field_0 + lVar68);
                    *pfVar3 = fVar128;
                    pfVar3[1] = fVar100;
                    pfVar3[2] = fVar90;
                    pfVar3[3] = fVar108;
                    uVar70 = uVar70 + 1;
                    lVar68 = lVar68 + 0x40;
                  } while (uVar70 < *(ulong *)&(pLVar2->vy).field_0);
                }
              }
              else {
                if (sVar14 != puVar69[2]) {
                  prVar64 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar64,"number of transformations does not match");
                  __cxa_throw(prVar64,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                uVar8 = *(undefined8 *)&(pLVar2->vx).field_0;
                fVar76 = (float)uVar8;
                fVar103 = (float)((ulong)uVar8 >> 0x20);
                fVar127 = (float)*puVar69;
                fVar128 = (float)((ulong)*puVar69 >> 0x20);
                uVar72 = -(uint)(fVar76 < fVar127);
                uVar74 = -(uint)(fVar103 < fVar128);
                local_158.time_range.upper =
                     (float)(~uVar74 & (uint)fVar128 | (uint)fVar103 & uVar74);
                local_158.time_range.lower =
                     (float)(~uVar72 & (uint)fVar76 | (uint)fVar127 & uVar72);
                local_158.spaces.size_active = 0;
                local_158.spaces.size_alloced = 0;
                local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
                if (sVar14 != 0) {
                  local_158.spaces.items =
                       (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                       alignedMalloc(sVar14 << 6,0x10);
                  psVar67 = extraout_RDX_19;
                  local_158.spaces.size_alloced = sVar14;
                }
                local_158.quaternion = true;
                if (*(undefined1 *)((long)&(pLVar2->vz).field_0 + 8) == '\0') {
                  local_158.quaternion = SUB41(*(undefined4 *)(puVar69 + 5),0);
                }
                local_158.spaces.size_active = local_158.spaces.size_alloced;
                if (*(size_t *)&(pLVar2->vy).field_0 != 0) {
                  lVar68 = 0x30;
                  uVar70 = 0;
                  do {
                    uVar72 = (uint)psVar67;
                    pAVar61 = *(AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **)
                               &(pLVar2->vz).field_0;
                    lVar16 = puVar69[4];
                    bVar11 = *(undefined1 *)((long)&(pLVar2->vz).field_0 + 8);
                    bVar12 = *(byte *)(puVar69 + 5);
                    local_158.quaternion = false;
                    fVar76 = *(float *)((long)pAVar61 + lVar68 + -0x30);
                    uVar8 = *(undefined8 *)((long)pAVar61 + lVar68 + -0x2c);
                    fVar103 = (float)((ulong)uVar8 >> 0x20);
                    local_188 = (float)uVar8;
                    if ((((fVar76 != 1.0) || (NAN(fVar76))) || (local_188 != 0.0)) ||
                       (((NAN(local_188) || (fVar103 != 0.0)) || (NAN(fVar103))))) {
LAB_0016bab6:
                      uVar8 = *(undefined8 *)(lVar16 + -0x30 + lVar68);
                      fVar127 = (float)uVar8;
                      fVar128 = (float)((ulong)uVar8 >> 0x20);
                      iVar73 = -(uint)(fVar127 != 1.0);
                      iVar75 = -(uint)(fVar128 != 0.0);
                      auVar88._4_4_ = iVar75;
                      auVar88._0_4_ = iVar73;
                      auVar88._8_4_ = iVar75;
                      auVar88._12_4_ = iVar75;
                      auVar87._8_8_ = auVar88._8_8_;
                      auVar87._4_4_ = iVar73;
                      auVar87._0_4_ = iVar73;
                      uVar72 = movmskpd(uVar72,auVar87);
                      psVar67 = (size_t *)(ulong)uVar72;
                      fVar76 = *(float *)(lVar16 + -0x28 + lVar68);
                      if ((uVar72 & 1) == 0) {
                        bVar66 = (byte)uVar72 >> 1;
                        uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                        psVar67 = (size_t *)(ulong)uVar72;
                        if (((bVar66 == 0) && (fVar76 == 0.0)) && (!NAN(fVar76))) {
                          pfVar3 = (float *)(lVar16 + -0x24 + lVar68);
                          auVar56._4_4_ = -(uint)(pfVar3[1] != 0.0);
                          auVar56._0_4_ = -(uint)(*pfVar3 != 0.0);
                          auVar56._8_4_ = -(uint)(pfVar3[2] != 1.0);
                          auVar56._12_4_ = -(uint)(pfVar3[3] != 0.0);
                          uVar72 = movmskps(uVar72,auVar56);
                          psVar67 = (size_t *)(ulong)uVar72;
                          if ((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                             ((uVar72 & 4) == 0)) {
                            bVar66 = ((byte)uVar72 & 8) >> 3;
                            uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                            psVar67 = (size_t *)(ulong)uVar72;
                            if (bVar66 == 0) {
                              pfVar3 = (float *)(lVar16 + -0x14 + lVar68);
                              auVar57._4_4_ = -(uint)(pfVar3[1] != 0.0);
                              auVar57._0_4_ = -(uint)(*pfVar3 != 0.0);
                              auVar57._8_4_ = -(uint)(pfVar3[2] != 0.0);
                              auVar57._12_4_ = -(uint)(pfVar3[3] != 1.0);
                              uVar72 = movmskps(uVar72,auVar57);
                              psVar67 = (size_t *)(ulong)uVar72;
                              if ((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                                 ((uVar72 & 4) == 0)) {
                                bVar66 = ((byte)uVar72 & 8) >> 3;
                                uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                                psVar67 = (size_t *)(ulong)uVar72;
                                if (bVar66 == 0) {
                                  pfVar3 = (float *)(lVar16 + -4 + lVar68);
                                  auVar58._4_4_ = -(uint)(pfVar3[1] != 0.0);
                                  auVar58._0_4_ = -(uint)(*pfVar3 != 0.0);
                                  auVar58._8_4_ = -(uint)(pfVar3[2] != 0.0);
                                  auVar58._12_4_ = -(uint)(pfVar3[3] != 0.0);
                                  uVar72 = movmskps(uVar72,auVar58);
                                  psVar67 = (size_t *)(ulong)uVar72;
                                  if ((((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                                       ((uVar72 & 4) == 0)) &&
                                      (bVar66 = ((byte)uVar72 & 8) >> 3,
                                      psVar67 = (size_t *)
                                                (ulong)CONCAT31((int3)(uVar72 >> 8),bVar66),
                                      bVar66 == 0)) &&
                                     ((bVar12 == 0 ||
                                      ((fVar113 = *(float *)(lVar16 + 0xc + lVar68), fVar113 == 1.0
                                       && (!NAN(fVar113))))))) {
                                    pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x30);
                                    fVar101 = *pfVar3;
                                    local_188 = pfVar3[1];
                                    fVar103 = pfVar3[2];
                                    fVar76 = pfVar3[3];
                                    pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x20);
                                    fVar127 = *pfVar3;
                                    fVar116 = pfVar3[1];
                                    fVar119 = pfVar3[2];
                                    fVar113 = pfVar3[3];
                                    pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x10);
                                    fVar122 = *pfVar3;
                                    fVar104 = pfVar3[1];
                                    fVar107 = pfVar3[2];
                                    fVar106 = pfVar3[3];
                                    pfVar3 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar68);
                                    fVar128 = *pfVar3;
                                    fVar100 = pfVar3[1];
                                    fVar90 = pfVar3[2];
                                    fVar108 = pfVar3[3];
                                    local_158.quaternion = (bool)bVar11;
                                    goto LAB_0016c5ac;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      if ((bVar11 == 0) && (bVar12 == 0)) {
                        pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x30);
                        fVar138 = *pfVar3;
                        fVar89 = pfVar3[1];
                        fVar91 = pfVar3[2];
                        fVar92 = pfVar3[3];
                        pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x20);
                        fVar93 = *pfVar3;
                        fVar94 = pfVar3[1];
                        fVar95 = pfVar3[2];
                        fVar96 = pfVar3[3];
                        pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x10);
                        fVar97 = *pfVar3;
                        fVar98 = pfVar3[1];
                        fVar102 = pfVar3[2];
                        fVar136 = pfVar3[3];
                        fVar101 = fVar127 * fVar138 + fVar128 * fVar93 + fVar76 * fVar97;
                        local_188 = fVar127 * fVar89 + fVar128 * fVar94 + fVar76 * fVar98;
                        fVar103 = fVar127 * fVar91 + fVar128 * fVar95 + fVar76 * fVar102;
                        fVar116 = *(float *)(lVar16 + -0x20 + lVar68);
                        fVar99 = *(float *)(lVar16 + -0x1c + lVar68);
                        fVar129 = *(float *)(lVar16 + -0x18 + lVar68);
                        fVar106 = *(float *)(lVar16 + -0x10 + lVar68);
                        fVar119 = fVar116 * fVar91 + fVar99 * fVar95 + fVar129 * fVar102;
                        fVar113 = fVar116 * fVar92 + fVar99 * fVar96 + fVar129 * fVar136;
                        fVar100 = *(float *)(lVar16 + -0xc + lVar68);
                        fVar90 = *(float *)(lVar16 + -8 + lVar68);
                        fVar122 = fVar106 * fVar138 + fVar100 * fVar93 + fVar90 * fVar97;
                        fVar104 = fVar106 * fVar89 + fVar100 * fVar94 + fVar90 * fVar98;
                        fVar107 = fVar106 * fVar91 + fVar100 * fVar95 + fVar90 * fVar102;
                        fVar108 = *(float *)(lVar16 + lVar68);
                        fVar130 = *(float *)(lVar16 + 4 + lVar68);
                        fVar135 = *(float *)(lVar16 + 8 + lVar68);
                        pfVar3 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar68);
                        fVar106 = fVar106 * fVar92 + fVar100 * fVar96 + fVar90 * fVar136;
                        fVar76 = fVar127 * fVar92 + fVar128 * fVar96 + fVar76 * fVar136;
                        fVar128 = fVar108 * fVar138 + fVar130 * fVar93 + fVar135 * fVar97 + *pfVar3;
                        fVar100 = fVar108 * fVar89 + fVar130 * fVar94 + fVar135 * fVar98 + pfVar3[1]
                        ;
                        fVar90 = fVar108 * fVar91 + fVar130 * fVar95 + fVar135 * fVar102 + pfVar3[2]
                        ;
                        fVar108 = fVar108 * fVar92 + fVar130 * fVar96 + fVar135 * fVar136 +
                                  pfVar3[3];
                        fVar127 = fVar116 * fVar138 + fVar99 * fVar93 + fVar129 * fVar97;
                        fVar116 = fVar116 * fVar89 + fVar99 * fVar94 + fVar129 * fVar98;
                      }
                      else if ((bVar11 == 0) || (bVar12 == 0)) {
                        if ((bVar11 == 0) || (bVar12 != 0)) {
                          if ((local_188 != 0.0) ||
                             ((((NAN(local_188) || (fVar103 != 0.0)) || (NAN(fVar103))) ||
                              (uVar8 = *(undefined8 *)((long)pAVar61 + lVar68 + -0x10),
                              auVar40._4_4_ =
                                   -(uint)(*(float *)((long)pAVar61 + lVar68 + -0x20) != 0.0),
                              auVar40._0_4_ =
                                   -(uint)(*(float *)((long)pAVar61 + lVar68 + -0x18) != 0.0),
                              auVar40._8_4_ = -(uint)((float)uVar8 != 0.0),
                              auVar40._12_4_ = -(uint)((float)((ulong)uVar8 >> 0x20) != 0.0),
                              uVar59 = movmskps((int)CONCAT71(uVar65,bVar12),auVar40),
                              (char)uVar59 != '\0')))) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                       ,0x83);
                            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                            std::ostream::put(-0x30);
                            std::ostream::flush();
                            psVar67 = extraout_RDX_22;
                          }
                          pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                          fVar76 = pfVar3[3];
                          pfVar4 = (float *)(lVar16 + -0x20 + lVar68);
                          fVar127 = *pfVar4;
                          fVar113 = pfVar4[3];
                          pfVar5 = (float *)(lVar16 + -0x10 + lVar68);
                          fVar122 = *pfVar5;
                          fVar104 = pfVar5[1];
                          fVar106 = pfVar5[3];
                          pfVar7 = (float *)(lVar16 + lVar68);
                          fVar128 = *pfVar7;
                          fVar100 = pfVar7[1];
                          fVar90 = pfVar7[2];
                          fVar108 = pfVar7[3];
                          uVar8 = *(undefined8 *)((long)&(pAVar61->l).vx.field_0 + lVar68);
                          fVar101 = *(float *)((long)pAVar61 + lVar68 + -0x30) * *pfVar3;
                          local_188 = pfVar3[1] + (float)uVar8;
                          fVar103 = pfVar3[2] + (float)((ulong)uVar8 >> 0x20);
                          fVar119 = pfVar4[2] +
                                    *(float *)((long)&(pAVar61->l).vx.field_0 + lVar68 + 8);
                          fVar116 = pfVar4[1] * *(float *)((long)pAVar61 + lVar68 + -0x1c);
                          fVar107 = pfVar5[2] * *(float *)((long)pAVar61 + lVar68 + -8);
                          local_158.quaternion = true;
                        }
                        else {
                          local_e8 = ZEXT416(*(uint *)((long)&(pAVar61->l).vx.field_0 + lVar68 + 0xc
                                                      ));
                          local_c8 = ZEXT416(*(uint *)((long)pAVar61 + lVar68 + -0x24));
                          _local_f8 = ZEXT416(*(uint *)((long)pAVar61 + lVar68 + -4));
                          pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x20);
                          local_108 = *pfVar3;
                          fStack_104 = pfVar3[1];
                          fStack_fc = pfVar3[3];
                          pfVar4 = (float *)((long)pAVar61 + lVar68 + -0x10);
                          fVar76 = *pfVar4;
                          fVar127 = pfVar4[1];
                          local_118 = *(undefined8 *)pfVar4;
                          fVar128 = pfVar4[2];
                          uStack_110 = *(undefined8 *)(pfVar4 + 2);
                          local_d8._8_8_ = 0;
                          local_d8._0_8_ = *(ulong *)((long)pAVar61 + lVar68 + -0x18);
                          pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x30);
                          local_a8 = *pfVar3;
                          fStack_9c = pfVar3[1];
                          pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                          fVar113 = *pfVar3;
                          fVar122 = pfVar3[1];
                          fVar104 = pfVar3[2];
                          pfVar3 = (float *)(lVar16 + -0x20 + lVar68);
                          fVar106 = *pfVar3;
                          fVar100 = pfVar3[1];
                          fVar90 = pfVar3[2];
                          puVar6 = (ulong *)(lVar16 + -0x10 + lVar68);
                          local_88 = *puVar6;
                          uStack_80 = puVar6[1];
                          pfVar3 = (float *)(lVar16 + lVar68);
                          fVar108 = *pfVar3;
                          fVar116 = pfVar3[1];
                          fVar119 = pfVar3[2];
                          fVar101 = fVar113 * local_a8 + fVar122 * local_108 + fVar104 * fVar76;
                          fVar107 = fVar113 * 0.0 + fVar122 * fStack_104 + fVar104 * fVar127;
                          fVar113 = fVar113 * 0.0 + fVar122 * 0.0 + fVar104 * fVar128;
                          local_128 = fVar106 * local_a8 + fVar100 * local_108 + fVar90 * fVar76;
                          fStack_124 = fVar106 * 0.0 + fVar100 * fStack_104 + fVar90 * fVar127;
                          fStack_120 = fVar106 * 0.0 + fVar100 * 0.0 + fVar90 * fVar128;
                          fStack_11c = fVar106 * fStack_9c +
                                       fVar100 * fStack_fc + fVar90 * pfVar4[3];
                          fStack_100 = 0.0;
                          fStack_a4 = 0.0;
                          fStack_a0 = 0.0;
                          pfVar3 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar68);
                          local_b8._4_4_ =
                               fVar108 * 0.0 + fVar116 * fStack_104 + fVar119 * fVar127 + pfVar3[1];
                          local_b8._0_4_ =
                               fVar108 * local_a8 + fVar116 * local_108 + fVar119 * fVar76 + *pfVar3
                          ;
                          fStack_b0 = fVar108 * 0.0 + fVar116 * 0.0 + fVar119 * fVar128 + pfVar3[2];
                          fStack_ac = fVar108 * fStack_9c +
                                      fVar116 * fStack_fc + fVar119 * pfVar4[3] + pfVar3[3];
                          if ((((fVar107 != 0.0) || (NAN(fVar107))) ||
                              ((fVar113 != 0.0 || ((NAN(fVar113) || (fStack_120 != 0.0)))))) ||
                             (NAN(fStack_120))) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                       ,0x61);
                            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                            std::ostream::put(-0x30);
                            std::ostream::flush();
                            psVar67 = extraout_RDX_21;
                          }
                          fVar122 = local_a8 * (float)local_88 +
                                    local_108 * local_88._4_4_ + (float)local_118 * (float)uStack_80
                          ;
                          fVar104 = fStack_a4 * (float)local_88 +
                                    fStack_104 * local_88._4_4_ + local_118._4_4_ * (float)uStack_80
                          ;
                          fVar107 = fStack_a0 * (float)local_88 +
                                    fStack_100 * local_88._4_4_ +
                                    (float)uStack_110 * (float)uStack_80;
                          local_158.quaternion = true;
                          fVar119 = local_d8._0_4_;
                          fVar113 = local_d8._4_4_;
                          fVar106 = (float)local_f8._0_4_;
                          fVar76 = (float)local_c8._0_4_;
                          fVar128 = (float)local_b8._0_4_;
                          fVar100 = (float)local_b8._4_4_;
                          fVar90 = fStack_b0;
                          fVar108 = (float)local_e8._0_4_;
                          fVar127 = local_128;
                          fVar116 = fStack_124;
                        }
                      }
                      else {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                   ,0x67);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                        std::ostream::put(-0x30);
                        std::ostream::flush();
                        fVar76 = *(float *)((long)&(pAVar61->l).vx.field_0 + lVar68 + 0xc);
                        fVar103 = *(float *)((long)pAVar61 + lVar68 + -0x24);
                        fVar127 = *(float *)((long)pAVar61 + lVar68 + -0x14);
                        fVar128 = *(float *)((long)pAVar61 + lVar68 + -4);
                        auVar10 = *(undefined1 (*) [16])((long)pAVar61 + lVar68 + -0x30);
                        pfVar4 = (float *)((long)pAVar61 + lVar68 + -0x20);
                        fVar113 = *pfVar4;
                        fVar122 = pfVar4[1];
                        pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x10);
                        fVar104 = *pfVar3;
                        fVar106 = pfVar3[1];
                        fVar100 = pfVar3[2];
                        fVar130 = fVar103 * fVar127 + fVar76 * fVar128;
                        fVar101 = fVar103 * fVar127 - fVar76 * fVar128;
                        fVar119 = fVar76 * fVar76 + fVar103 * fVar103 + -fVar127 * fVar127 +
                                  -fVar128 * fVar128;
                        fVar107 = fVar76 * fVar76 - fVar103 * fVar103;
                        fVar129 = fVar127 * fVar127 + fVar107 + -fVar128 * fVar128;
                        fVar138 = fVar103 * fVar128 - fVar76 * fVar127;
                        fVar90 = fVar76 * fVar127 + fVar103 * fVar128;
                        fVar135 = fVar127 * fVar128 + fVar76 * fVar103;
                        fVar76 = fVar127 * fVar128 - fVar76 * fVar103;
                        pfVar3 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar68);
                        fVar108 = *pfVar3;
                        fVar116 = pfVar3[1];
                        fVar99 = pfVar3[2];
                        fVar130 = fVar130 + fVar130;
                        fVar138 = fVar138 + fVar138;
                        fVar101 = fVar101 + fVar101;
                        fVar135 = fVar135 + fVar135;
                        fVar90 = fVar90 + fVar90;
                        fVar76 = fVar76 + fVar76;
                        fVar103 = fVar128 * fVar128 + fVar107 + -fVar127 * fVar127;
                        fVar110 = fVar119 * 1.0 + fVar130 * 0.0 + fVar138 * 0.0;
                        fVar112 = fVar119 * 0.0 + fVar130 * 1.0 + fVar138 * 0.0;
                        fVar115 = fVar119 * 0.0 + fVar130 * 0.0 + fVar138 * 1.0;
                        fVar117 = fVar119 * 0.0 + fVar130 * 0.0 + fVar138 * 0.0;
                        fVar137 = fVar101 * 1.0 + fVar129 * 0.0 + fVar135 * 0.0;
                        fVar139 = fVar101 * 0.0 + fVar129 * 1.0 + fVar135 * 0.0;
                        fVar124 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 1.0;
                        fVar109 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 0.0;
                        fVar129 = fVar90 * 1.0 + fVar76 * 0.0 + fVar103 * 0.0;
                        fVar135 = fVar90 * 0.0 + fVar76 * 1.0 + fVar103 * 0.0;
                        fVar89 = fVar90 * 0.0 + fVar76 * 0.0 + fVar103 * 1.0;
                        fVar92 = fVar90 * 0.0 + fVar76 * 0.0 + fVar103 * 0.0;
                        local_178 = auVar10._4_4_;
                        fStack_174 = auVar10._8_4_;
                        local_188 = auVar10._0_4_;
                        fVar121 = local_188 * fVar110 + fVar137 * 0.0 + fVar129 * 0.0;
                        fVar123 = local_188 * fVar112 + fVar139 * 0.0 + fVar135 * 0.0;
                        fVar125 = local_188 * fVar115 + fVar124 * 0.0 + fVar89 * 0.0;
                        fVar126 = local_188 * fVar117 + fVar109 * 0.0 + fVar92 * 0.0;
                        fVar130 = fVar113 * fVar110 + fVar122 * fVar137 + fVar129 * 0.0;
                        fVar138 = fVar113 * fVar112 + fVar122 * fVar139 + fVar135 * 0.0;
                        fVar91 = fVar113 * fVar115 + fVar122 * fVar124 + fVar89 * 0.0;
                        fVar93 = fVar113 * fVar117 + fVar122 * fVar109 + fVar92 * 0.0;
                        local_128 = fVar104 * fVar110 + fVar106 * fVar137 + fVar100 * fVar129;
                        fStack_124 = fVar104 * fVar112 + fVar106 * fVar139 + fVar100 * fVar135;
                        fStack_120 = fVar104 * fVar115 + fVar106 * fVar124 + fVar100 * fVar89;
                        fStack_11c = fVar104 * fVar117 + fVar106 * fVar109 + fVar100 * fVar92;
                        fVar76 = *(float *)(lVar16 + 0xc + lVar68);
                        fVar103 = *(float *)(lVar16 + -0x24 + lVar68);
                        fVar127 = *(float *)(lVar16 + -0x14 + lVar68);
                        fVar128 = *(float *)(lVar16 + -4 + lVar68);
                        fVar107 = fVar103 * fVar127 + fVar76 * fVar128;
                        fVar101 = fVar103 * fVar127 - fVar76 * fVar128;
                        fVar119 = fVar76 * fVar76 + fVar103 * fVar103 + -fVar127 * fVar127 +
                                  -fVar128 * fVar128;
                        fVar122 = fVar76 * fVar76 - fVar103 * fVar103;
                        fVar98 = fVar127 * fVar127 + fVar122 + -fVar128 * fVar128;
                        fVar96 = fVar103 * fVar128 - fVar76 * fVar127;
                        fVar97 = fVar76 * fVar127 + fVar103 * fVar128;
                        fVar102 = fVar127 * fVar128 + fVar76 * fVar103;
                        fVar90 = fVar127 * fVar128 - fVar76 * fVar103;
                        pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                        fVar76 = *pfVar3;
                        pfVar5 = (float *)(lVar16 + -0x20 + lVar68);
                        fVar103 = *pfVar5;
                        fVar113 = pfVar5[1];
                        fVar136 = fVar128 * fVar128 + fVar122 + -fVar127 * fVar127;
                        pfVar7 = (float *)(lVar16 + -0x10 + lVar68);
                        fVar127 = *pfVar7;
                        fVar128 = pfVar7[1];
                        fVar122 = pfVar7[2];
                        fVar107 = fVar107 + fVar107;
                        fVar96 = fVar96 + fVar96;
                        pfVar7 = (float *)(lVar16 + lVar68);
                        fVar104 = *pfVar7;
                        fVar106 = pfVar7[1];
                        fVar100 = pfVar7[2];
                        fVar94 = fVar119 * 1.0 + fVar107 * 0.0 + fVar96 * 0.0;
                        fVar95 = fVar119 * 0.0 + fVar107 * 1.0 + fVar96 * 0.0;
                        fVar96 = fVar119 * 0.0 + fVar107 * 0.0 + fVar96 * 1.0;
                        fVar101 = fVar101 + fVar101;
                        fVar102 = fVar102 + fVar102;
                        fVar97 = fVar97 + fVar97;
                        fVar90 = fVar90 + fVar90;
                        fVar119 = fVar101 * 1.0 + fVar98 * 0.0 + fVar102 * 0.0;
                        fVar107 = fVar101 * 0.0 + fVar98 * 1.0 + fVar102 * 0.0;
                        fVar101 = fVar101 * 0.0 + fVar98 * 0.0 + fVar102 * 1.0;
                        fVar98 = fVar97 * 1.0 + fVar90 * 0.0 + fVar136 * 0.0;
                        fVar102 = fVar97 * 0.0 + fVar90 * 1.0 + fVar136 * 0.0;
                        fVar90 = fVar97 * 0.0 + fVar90 * 0.0 + fVar136 * 1.0;
                        fVar111 = fVar76 * fVar94 + fVar119 * 0.0 + fVar98 * 0.0;
                        fVar114 = fVar76 * fVar95 + fVar107 * 0.0 + fVar102 * 0.0;
                        fVar76 = fVar76 * fVar96 + fVar101 * 0.0 + fVar90 * 0.0;
                        fVar97 = fVar103 * fVar94 + fVar113 * fVar119 + fVar98 * 0.0;
                        fVar136 = fVar103 * fVar95 + fVar113 * fVar107 + fVar102 * 0.0;
                        fVar105 = fVar103 * fVar96 + fVar113 * fVar101 + fVar90 * 0.0;
                        fVar118 = fVar127 * fVar94 + fVar128 * fVar119 + fVar122 * fVar98;
                        fVar120 = fVar127 * fVar95 + fVar128 * fVar107 + fVar122 * fVar102;
                        fVar128 = fVar127 * fVar96 + fVar128 * fVar101 + fVar122 * fVar90;
                        fVar127 = fVar104 * fVar94 + fVar106 * fVar119 + fVar100 * fVar98 +
                                  pfVar3[1] + 0.0;
                        fVar94 = fVar104 * fVar95 + fVar106 * fVar107 + fVar100 * fVar102 +
                                 pfVar3[2] + 0.0;
                        fVar95 = fVar104 * fVar96 + fVar106 * fVar101 + fVar100 * fVar90 +
                                 pfVar5[2] + 0.0;
                        fVar101 = fVar111 * fVar121 + fVar114 * fVar130 + fVar76 * local_128;
                        local_188 = fVar111 * fVar123 + fVar114 * fVar138 + fVar76 * fStack_124;
                        fVar103 = fVar111 * fVar125 + fVar114 * fVar91 + fVar76 * fStack_120;
                        fVar119 = fVar97 * fVar125 + fVar136 * fVar91 + fVar105 * fStack_120;
                        fVar113 = fVar97 * fVar126 + fVar136 * fVar93 + fVar105 * fStack_11c;
                        fVar122 = fVar118 * fVar121 + fVar120 * fVar130 + fVar128 * local_128;
                        fVar104 = fVar118 * fVar123 + fVar120 * fVar138 + fVar128 * fStack_124;
                        fVar107 = fVar118 * fVar125 + fVar120 * fVar91 + fVar128 * fStack_120;
                        psVar67 = extraout_RDX_20;
                        fVar106 = fVar118 * fVar126 + fVar120 * fVar93 + fVar128 * fStack_11c;
                        fVar76 = fVar111 * fVar126 + fVar114 * fVar93 + fVar76 * fStack_11c;
                        fVar128 = fVar127 * fVar121 + fVar94 * fVar130 + fVar95 * local_128 +
                                  fVar108 * fVar110 + fVar116 * fVar137 + fVar99 * fVar129 +
                                  local_178 + 0.0;
                        fVar100 = fVar127 * fVar123 + fVar94 * fVar138 + fVar95 * fStack_124 +
                                  fVar108 * fVar112 + fVar116 * fVar139 + fVar99 * fVar135 +
                                  fStack_174 + 0.0;
                        fVar90 = fVar127 * fVar125 + fVar94 * fVar91 + fVar95 * fStack_120 +
                                 fVar108 * fVar115 + fVar116 * fVar124 + fVar99 * fVar89 +
                                 pfVar4[2] + 0.0;
                        fVar108 = fVar127 * fVar126 + fVar94 * fVar93 + fVar95 * fStack_11c +
                                  fVar108 * fVar117 + fVar116 * fVar109 + fVar99 * fVar92 + 0.0;
                        fVar127 = fVar97 * fVar121 + fVar136 * fVar130 + fVar105 * local_128;
                        fVar116 = fVar97 * fVar123 + fVar136 * fVar138 + fVar105 * fStack_124;
                      }
                    }
                    else {
                      pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x24);
                      auVar37._4_4_ = -(uint)(pfVar3[1] != 0.0);
                      auVar37._0_4_ = -(uint)(*pfVar3 != 0.0);
                      auVar37._8_4_ = -(uint)(pfVar3[2] != 1.0);
                      auVar37._12_4_ = -(uint)(pfVar3[3] != 0.0);
                      uVar72 = movmskps(uVar72,auVar37);
                      if ((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                         (((uVar72 & 4) != 0 ||
                          (bVar66 = ((byte)uVar72 & 8) >> 3,
                          uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66), bVar66 != 0))))
                      goto LAB_0016bab6;
                      pfVar3 = (float *)((long)pAVar61 + lVar68 + -0x14);
                      auVar38._4_4_ = -(uint)(pfVar3[1] != 0.0);
                      auVar38._0_4_ = -(uint)(*pfVar3 != 0.0);
                      auVar38._8_4_ = -(uint)(pfVar3[2] != 0.0);
                      auVar38._12_4_ = -(uint)(pfVar3[3] != 1.0);
                      uVar72 = movmskps(uVar72,auVar38);
                      if (((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                          ((uVar72 & 4) != 0)) ||
                         (bVar66 = ((byte)uVar72 & 8) >> 3,
                         uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66), bVar66 != 0))
                      goto LAB_0016bab6;
                      pfVar3 = (float *)((long)pAVar61 + lVar68 + -4);
                      auVar39._4_4_ = -(uint)(pfVar3[1] != 0.0);
                      auVar39._0_4_ = -(uint)(*pfVar3 != 0.0);
                      auVar39._8_4_ = -(uint)(pfVar3[2] != 0.0);
                      auVar39._12_4_ = -(uint)(pfVar3[3] != 0.0);
                      uVar72 = movmskps(uVar72,auVar39);
                      if ((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                         ((uVar72 & 4) != 0)) goto LAB_0016bab6;
                      bVar66 = ((byte)uVar72 & 8) >> 3;
                      uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                      psVar67 = (size_t *)(ulong)uVar72;
                      if ((bVar66 != 0) ||
                         ((bVar11 != 0 &&
                          ((fVar76 = *(float *)((long)&(pAVar61->l).vx.field_0 + lVar68 + 0xc),
                           fVar76 != 1.0 || (NAN(fVar76))))))) goto LAB_0016bab6;
                      pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                      fVar101 = *pfVar3;
                      local_188 = pfVar3[1];
                      fVar103 = pfVar3[2];
                      fVar76 = pfVar3[3];
                      pfVar3 = (float *)(lVar16 + -0x20 + lVar68);
                      fVar127 = *pfVar3;
                      fVar116 = pfVar3[1];
                      fVar119 = pfVar3[2];
                      fVar113 = pfVar3[3];
                      pfVar3 = (float *)(lVar16 + -0x10 + lVar68);
                      fVar122 = *pfVar3;
                      fVar104 = pfVar3[1];
                      fVar107 = pfVar3[2];
                      fVar106 = pfVar3[3];
                      pfVar3 = (float *)(lVar16 + lVar68);
                      fVar128 = *pfVar3;
                      fVar100 = pfVar3[1];
                      fVar90 = pfVar3[2];
                      fVar108 = pfVar3[3];
                      local_158.quaternion = (bool)bVar12;
                    }
LAB_0016c5ac:
                    pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x30);
                    *pfVar3 = fVar101;
                    pfVar3[1] = local_188;
                    pfVar3[2] = fVar103;
                    pfVar3[3] = fVar76;
                    pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x20);
                    *pfVar3 = fVar127;
                    pfVar3[1] = fVar116;
                    pfVar3[2] = fVar119;
                    pfVar3[3] = fVar113;
                    pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x10);
                    *pfVar3 = fVar122;
                    pfVar3[1] = fVar104;
                    pfVar3[2] = fVar107;
                    pfVar3[3] = fVar106;
                    pfVar3 = (float *)((long)&((local_158.spaces.items)->l).vx.field_0 + lVar68);
                    *pfVar3 = fVar128;
                    pfVar3[1] = fVar100;
                    pfVar3[2] = fVar90;
                    pfVar3[3] = fVar108;
                    uVar70 = uVar70 + 1;
                    lVar68 = lVar68 + 0x40;
                  } while (uVar70 < *(ulong *)&(pLVar2->vy).field_0);
                }
              }
            }
            std::
            vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
            ::emplace_back<embree::SceneGraph::Transformations>
                      ((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                        *)local_58,&local_158);
            alignedFree(local_158.spaces.items);
            local_158.spaces.size_active = 0;
            local_158.spaces.size_alloced = 0;
            local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            pRVar71 = (Ref<embree::SceneGraph::Node> *)((long)&local_68->ptr + 1);
            pAVar61 = *(AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **)local_38;
          } while (pRVar71 < (Ref<embree::SceneGraph::Node> *)
                             (((long)local_38->_M_parent - (long)pAVar61 >> 4) * -0x5555555555555555
                             ));
        }
        plVar62 = local_70;
        convertInstances(local_90,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   *)local_98,(Ref<embree::SceneGraph::Node> *)(local_70 + 0x10),
                         (vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                          *)local_58);
        std::
        vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
        ::~vector((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                   *)local_58);
      }
      if (plVar62 != (long *)0x0) {
        (**(code **)(*plVar62 + 0x18))(plVar62);
      }
    }
    else {
      (**(code **)(*plVar60 + 0x10))(plVar60);
      pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                (spaces->
                super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
          (spaces->
          super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          )._M_impl.super__Vector_impl_data._M_finish != pAVar61) {
        local_68 = (Ref<embree::SceneGraph::Node> *)(plVar60 + 0x13);
        uVar70 = 0;
        do {
          psVar67 = &local_158.spaces.size_active;
          pLVar2 = &pAVar61->l + uVar70;
          sVar14 = *(size_t *)&(&pAVar61->l)[uVar70].vy.field_0;
          local_88 = uVar70;
          if (sVar14 == 1) {
            uVar8 = *(undefined8 *)&(pLVar2->vx).field_0;
            fVar76 = (float)uVar8;
            fVar103 = (float)((ulong)uVar8 >> 0x20);
            fVar127 = (float)plVar60[0xd];
            fVar128 = (float)((ulong)plVar60[0xd] >> 0x20);
            uVar72 = -(uint)(fVar76 < fVar127);
            uVar74 = -(uint)(fVar103 < fVar128);
            sVar14 = plVar60[0xf];
            local_158.time_range.upper = (float)(~uVar74 & (uint)fVar128 | (uint)fVar103 & uVar74);
            local_158.time_range.lower = (float)(~uVar72 & (uint)fVar76 | (uint)fVar127 & uVar72);
            local_158.spaces.size_active = 0;
            local_158.spaces.size_alloced = 0;
            local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            if (sVar14 != 0) {
              pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                        alignedMalloc(sVar14 << 6,0x10);
              psVar67 = extraout_RDX;
              local_158.spaces.size_alloced = sVar14;
              local_158.spaces.items = pAVar61;
            }
            local_158.quaternion = false;
            local_158.spaces.size_active = local_158.spaces.size_alloced;
            if (plVar60[0xf] != 0) {
              lVar68 = 0x30;
              uVar70 = 0;
              do {
                uVar72 = (uint)psVar67;
                pAVar15 = *(AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **)
                           &(pLVar2->vz).field_0;
                lVar16 = plVar60[0x11];
                bVar11 = *(undefined1 *)((long)&(pLVar2->vz).field_0 + 8);
                bVar12 = *(byte *)(plVar60 + 0x12);
                local_158.quaternion = false;
                fVar76 = (pAVar15->l).vx.field_0.m128[0];
                uVar8 = *(undefined8 *)((long)&(pAVar15->l).vx.field_0 + 4);
                fVar103 = (float)((ulong)uVar8 >> 0x20);
                local_168 = (float)uVar8;
                if ((((fVar76 != 1.0) || (NAN(fVar76))) || (local_168 != 0.0)) ||
                   (((NAN(local_168) || (fVar103 != 0.0)) || (NAN(fVar103))))) {
LAB_00167930:
                  uVar8 = *(undefined8 *)(lVar16 + -0x30 + lVar68);
                  fVar127 = (float)uVar8;
                  fVar128 = (float)((ulong)uVar8 >> 0x20);
                  iVar73 = -(uint)(fVar127 != 1.0);
                  iVar75 = -(uint)(fVar128 != 0.0);
                  auVar78._4_4_ = iVar75;
                  auVar78._0_4_ = iVar73;
                  auVar78._8_4_ = iVar75;
                  auVar78._12_4_ = iVar75;
                  auVar77._8_8_ = auVar78._8_8_;
                  auVar77._4_4_ = iVar73;
                  auVar77._0_4_ = iVar73;
                  uVar72 = movmskpd(uVar72,auVar77);
                  psVar67 = (size_t *)(ulong)uVar72;
                  fVar76 = *(float *)(lVar16 + -0x28 + lVar68);
                  if ((uVar72 & 1) == 0) {
                    bVar66 = (byte)uVar72 >> 1;
                    uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                    psVar67 = (size_t *)(ulong)uVar72;
                    if (((bVar66 == 0) && (fVar76 == 0.0)) && (!NAN(fVar76))) {
                      pfVar3 = (float *)(lVar16 + -0x24 + lVar68);
                      auVar41._4_4_ = -(uint)(pfVar3[1] != 0.0);
                      auVar41._0_4_ = -(uint)(*pfVar3 != 0.0);
                      auVar41._8_4_ = -(uint)(pfVar3[2] != 1.0);
                      auVar41._12_4_ = -(uint)(pfVar3[3] != 0.0);
                      uVar72 = movmskps(uVar72,auVar41);
                      psVar67 = (size_t *)(ulong)uVar72;
                      if ((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                         ((uVar72 & 4) == 0)) {
                        bVar66 = ((byte)uVar72 & 8) >> 3;
                        uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                        psVar67 = (size_t *)(ulong)uVar72;
                        if (bVar66 == 0) {
                          pfVar3 = (float *)(lVar16 + -0x14 + lVar68);
                          auVar42._4_4_ = -(uint)(pfVar3[1] != 0.0);
                          auVar42._0_4_ = -(uint)(*pfVar3 != 0.0);
                          auVar42._8_4_ = -(uint)(pfVar3[2] != 0.0);
                          auVar42._12_4_ = -(uint)(pfVar3[3] != 1.0);
                          uVar72 = movmskps(uVar72,auVar42);
                          psVar67 = (size_t *)(ulong)uVar72;
                          if ((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                             ((uVar72 & 4) == 0)) {
                            bVar66 = ((byte)uVar72 & 8) >> 3;
                            uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                            psVar67 = (size_t *)(ulong)uVar72;
                            if (bVar66 == 0) {
                              pfVar3 = (float *)(lVar16 + -4 + lVar68);
                              auVar43._4_4_ = -(uint)(pfVar3[1] != 0.0);
                              auVar43._0_4_ = -(uint)(*pfVar3 != 0.0);
                              auVar43._8_4_ = -(uint)(pfVar3[2] != 0.0);
                              auVar43._12_4_ = -(uint)(pfVar3[3] != 0.0);
                              uVar72 = movmskps(uVar72,auVar43);
                              psVar67 = (size_t *)(ulong)uVar72;
                              if ((((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                                   ((uVar72 & 4) == 0)) &&
                                  (bVar66 = ((byte)uVar72 & 8) >> 3,
                                  psVar67 = (size_t *)(ulong)CONCAT31((int3)(uVar72 >> 8),bVar66),
                                  bVar66 == 0)) &&
                                 ((bVar12 == 0 ||
                                  ((fVar113 = *(float *)(lVar16 + 0xc + lVar68), fVar113 == 1.0 &&
                                   (!NAN(fVar113))))))) {
                                fVar101 = (pAVar15->l).vx.field_0.m128[0];
                                local_168 = (pAVar15->l).vx.field_0.m128[1];
                                fVar103 = (pAVar15->l).vx.field_0.m128[2];
                                fVar76 = (pAVar15->l).vx.field_0.m128[3];
                                fVar113 = (pAVar15->l).vy.field_0.m128[0];
                                fVar116 = (pAVar15->l).vy.field_0.m128[1];
                                fVar119 = (pAVar15->l).vy.field_0.m128[2];
                                fVar122 = (pAVar15->l).vy.field_0.m128[3];
                                fVar104 = (pAVar15->l).vz.field_0.m128[0];
                                fVar106 = (pAVar15->l).vz.field_0.m128[1];
                                fVar107 = (pAVar15->l).vz.field_0.m128[2];
                                fVar100 = (pAVar15->l).vz.field_0.m128[3];
                                fVar127 = (pAVar15->p).field_0.m128[0];
                                fVar128 = (pAVar15->p).field_0.m128[1];
                                fVar90 = (pAVar15->p).field_0.m128[2];
                                fVar108 = (pAVar15->p).field_0.m128[3];
                                local_158.quaternion = (bool)bVar11;
                                goto LAB_001683e9;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  if ((bVar11 == 0) && (bVar12 == 0)) {
                    fVar135 = (pAVar15->l).vx.field_0.m128[0];
                    fVar138 = (pAVar15->l).vx.field_0.m128[1];
                    fVar89 = (pAVar15->l).vx.field_0.m128[2];
                    fVar91 = (pAVar15->l).vx.field_0.m128[3];
                    fVar92 = (pAVar15->l).vy.field_0.m128[0];
                    fVar93 = (pAVar15->l).vy.field_0.m128[1];
                    fVar94 = (pAVar15->l).vy.field_0.m128[2];
                    fVar95 = (pAVar15->l).vy.field_0.m128[3];
                    fVar96 = (pAVar15->l).vz.field_0.m128[0];
                    fVar97 = (pAVar15->l).vz.field_0.m128[1];
                    fVar98 = (pAVar15->l).vz.field_0.m128[2];
                    fVar102 = (pAVar15->l).vz.field_0.m128[3];
                    fVar101 = fVar127 * fVar135 + fVar128 * fVar92 + fVar76 * fVar96;
                    local_168 = fVar127 * fVar138 + fVar128 * fVar93 + fVar76 * fVar97;
                    fVar103 = fVar127 * fVar89 + fVar128 * fVar94 + fVar76 * fVar98;
                    fVar122 = *(float *)(lVar16 + -0x20 + lVar68);
                    fVar104 = *(float *)(lVar16 + -0x1c + lVar68);
                    fVar106 = *(float *)(lVar16 + -0x18 + lVar68);
                    fVar100 = *(float *)(lVar16 + -0x10 + lVar68);
                    fVar113 = fVar122 * fVar135 + fVar104 * fVar92 + fVar106 * fVar96;
                    fVar116 = fVar122 * fVar138 + fVar104 * fVar93 + fVar106 * fVar97;
                    fVar119 = fVar122 * fVar89 + fVar104 * fVar94 + fVar106 * fVar98;
                    fVar122 = fVar122 * fVar91 + fVar104 * fVar95 + fVar106 * fVar102;
                    fVar90 = *(float *)(lVar16 + -0xc + lVar68);
                    fVar108 = *(float *)(lVar16 + -8 + lVar68);
                    fVar104 = fVar100 * fVar135 + fVar90 * fVar92 + fVar108 * fVar96;
                    fVar106 = fVar100 * fVar138 + fVar90 * fVar93 + fVar108 * fVar97;
                    fVar107 = fVar100 * fVar89 + fVar90 * fVar94 + fVar108 * fVar98;
                    fVar99 = *(float *)(lVar16 + lVar68);
                    fVar129 = *(float *)(lVar16 + 4 + lVar68);
                    fVar130 = *(float *)(lVar16 + 8 + lVar68);
                    fVar100 = fVar100 * fVar91 + fVar90 * fVar95 + fVar108 * fVar102;
                    fVar76 = fVar127 * fVar91 + fVar128 * fVar95 + fVar76 * fVar102;
                    fVar127 = fVar99 * fVar135 + fVar129 * fVar92 + fVar130 * fVar96 +
                              (pAVar15->p).field_0.m128[0];
                    fVar128 = fVar99 * fVar138 + fVar129 * fVar93 + fVar130 * fVar97 +
                              (pAVar15->p).field_0.m128[1];
                    fVar90 = fVar99 * fVar89 + fVar129 * fVar94 + fVar130 * fVar98 +
                             (pAVar15->p).field_0.m128[2];
                    fVar108 = fVar99 * fVar91 + fVar129 * fVar95 + fVar130 * fVar102 +
                              (pAVar15->p).field_0.m128[3];
                  }
                  else if ((bVar11 == 0) || (bVar12 == 0)) {
                    if ((bVar11 == 0) || (bVar12 != 0)) {
                      if ((local_168 != 0.0) ||
                         ((((NAN(local_168) || (fVar103 != 0.0)) || (NAN(fVar103))) ||
                          (uVar8 = *(undefined8 *)&(pAVar15->l).vz.field_0,
                          auVar21._4_4_ = -(uint)((pAVar15->l).vy.field_0.m128[0] != 0.0),
                          auVar21._0_4_ = -(uint)((pAVar15->l).vy.field_0.m128[2] != 0.0),
                          auVar21._8_4_ = -(uint)((float)uVar8 != 0.0),
                          auVar21._12_4_ = -(uint)((float)((ulong)uVar8 >> 0x20) != 0.0),
                          uVar59 = movmskps((int)CONCAT71((int7)((ulong)pAVar61 >> 8),bVar12),
                                            auVar21), (char)uVar59 != '\0')))) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                   ,0x83);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                        std::ostream::put(-0x30);
                        std::ostream::flush();
                        psVar67 = extraout_RDX_02;
                      }
                      pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                      fVar76 = pfVar3[3];
                      pfVar4 = (float *)(lVar16 + -0x20 + lVar68);
                      fVar113 = *pfVar4;
                      fVar122 = pfVar4[3];
                      pfVar5 = (float *)(lVar16 + -0x10 + lVar68);
                      fVar104 = *pfVar5;
                      fVar106 = pfVar5[1];
                      fVar100 = pfVar5[3];
                      pfVar7 = (float *)(lVar16 + lVar68);
                      fVar127 = *pfVar7;
                      fVar128 = pfVar7[1];
                      fVar90 = pfVar7[2];
                      fVar108 = pfVar7[3];
                      uVar8 = *(undefined8 *)&(pAVar15->p).field_0;
                      fVar101 = (pAVar15->l).vx.field_0.m128[0] * *pfVar3;
                      local_168 = pfVar3[1] + (float)uVar8;
                      fVar103 = pfVar3[2] + (float)((ulong)uVar8 >> 0x20);
                      fVar119 = pfVar4[2] + (pAVar15->p).field_0.m128[2];
                      fVar116 = pfVar4[1] * (pAVar15->l).vy.field_0.m128[1];
                      fVar107 = pfVar5[2] * (pAVar15->l).vz.field_0.m128[2];
                      local_158.quaternion = true;
                    }
                    else {
                      local_d8 = ZEXT416((uint)(pAVar15->p).field_0.m128[3]);
                      _local_b8 = ZEXT416((uint)(pAVar15->l).vx.field_0.m128[3]);
                      local_e8 = ZEXT416((uint)(pAVar15->l).vz.field_0.m128[3]);
                      pVVar1 = &(pAVar15->l).vy;
                      fVar119 = (pVVar1->field_0).m128[0];
                      fVar107 = (pAVar15->l).vy.field_0.m128[1];
                      fStack_ec = (pAVar15->l).vy.field_0.m128[3];
                      local_108 = (pAVar15->l).vz.field_0.m128[0];
                      fStack_104 = (pAVar15->l).vz.field_0.m128[1];
                      fStack_100 = (pAVar15->l).vz.field_0.m128[2];
                      fStack_fc = (pAVar15->l).vz.field_0.m128[3];
                      local_c8._8_8_ = 0;
                      local_c8._0_8_ = *(ulong *)((long)&(pAVar15->l).vy.field_0 + 8);
                      local_128 = (pAVar15->l).vx.field_0.m128[0];
                      fStack_11c = (pAVar15->l).vx.field_0.m128[1];
                      pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                      fVar76 = *pfVar3;
                      fVar127 = pfVar3[1];
                      fVar128 = pfVar3[2];
                      pfVar3 = (float *)(lVar16 + -0x20 + lVar68);
                      fVar122 = *pfVar3;
                      fVar104 = pfVar3[1];
                      fVar106 = pfVar3[2];
                      puVar69 = (undefined8 *)(lVar16 + -0x10 + lVar68);
                      local_118 = *puVar69;
                      uStack_110 = puVar69[1];
                      pfVar3 = (float *)(lVar16 + lVar68);
                      fVar100 = *pfVar3;
                      fVar90 = pfVar3[1];
                      fVar108 = pfVar3[2];
                      fVar101 = fVar76 * local_128 + fVar127 * fVar119 + fVar128 * local_108;
                      fVar99 = fVar76 * 0.0 + fVar127 * fVar107 + fVar128 * fStack_104;
                      fVar127 = fVar76 * 0.0 + fVar127 * 0.0 + fVar128 * fStack_100;
                      fVar113 = fVar122 * local_128 + fVar104 * fVar119 + fVar106 * local_108;
                      fVar116 = fVar122 * 0.0 + fVar104 * fVar107 + fVar106 * fStack_104;
                      fVar76 = fVar122 * 0.0 + fVar104 * 0.0 + fVar106 * fStack_100;
                      fStack_f0 = 0.0;
                      local_f8 = (undefined1  [8])*(ulong *)&pVVar1->field_0;
                      fStack_124 = 0.0;
                      fStack_120 = 0.0;
                      local_a8 = fVar100 * local_128 + fVar90 * fVar119 + fVar108 * local_108 +
                                 (pAVar15->p).field_0.m128[0];
                      fStack_a4 = fVar100 * 0.0 + fVar90 * fVar107 + fVar108 * fStack_104 +
                                  (pAVar15->p).field_0.m128[1];
                      fStack_a0 = fVar100 * 0.0 + fVar90 * 0.0 + fVar108 * fStack_100 +
                                  (pAVar15->p).field_0.m128[2];
                      fStack_9c = fVar100 * fStack_11c + fVar90 * fStack_ec + fVar108 * fStack_fc +
                                  (pAVar15->p).field_0.m128[3];
                      if ((((fVar99 != 0.0) || (NAN(fVar99))) ||
                          ((fVar127 != 0.0 || ((NAN(fVar127) || (fVar76 != 0.0)))))) ||
                         (NAN(fVar76))) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                   ,0x61);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                        std::ostream::put(-0x30);
                        std::ostream::flush();
                        psVar67 = extraout_RDX_01;
                      }
                      fVar104 = local_128 * (float)local_118 +
                                (float)local_f8._0_4_ * local_118._4_4_ +
                                local_108 * (float)uStack_110;
                      fVar106 = fStack_124 * (float)local_118 +
                                (float)local_f8._4_4_ * local_118._4_4_ +
                                fStack_104 * (float)uStack_110;
                      fVar107 = fStack_120 * (float)local_118 +
                                fStack_f0 * local_118._4_4_ + fStack_100 * (float)uStack_110;
                      local_158.quaternion = true;
                      fVar119 = local_c8._0_4_;
                      fVar122 = local_c8._4_4_;
                      fVar100 = (float)local_e8._0_4_;
                      fVar76 = (float)local_b8._0_4_;
                      fVar127 = local_a8;
                      fVar128 = fStack_a4;
                      fVar90 = fStack_a0;
                      fVar108 = (float)local_d8._0_4_;
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                               ,0x67);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                    std::ostream::put(-0x30);
                    std::ostream::flush();
                    fVar76 = (pAVar15->p).field_0.m128[3];
                    fVar103 = (pAVar15->l).vx.field_0.m128[3];
                    fVar127 = (pAVar15->l).vy.field_0.m128[3];
                    fVar128 = (pAVar15->l).vz.field_0.m128[3];
                    aVar9 = (pAVar15->l).vx.field_0.field_1;
                    fVar113 = (pAVar15->l).vy.field_0.m128[0];
                    fVar122 = (pAVar15->l).vy.field_0.m128[1];
                    fVar104 = (pAVar15->l).vz.field_0.m128[0];
                    fVar106 = (pAVar15->l).vz.field_0.m128[1];
                    fVar100 = (pAVar15->l).vz.field_0.m128[2];
                    fVar130 = fVar103 * fVar127 + fVar76 * fVar128;
                    fVar101 = fVar103 * fVar127 - fVar76 * fVar128;
                    fVar116 = fVar76 * fVar76 + fVar103 * fVar103 + -fVar127 * fVar127 +
                              -fVar128 * fVar128;
                    fVar119 = fVar76 * fVar76 - fVar103 * fVar103;
                    fVar107 = fVar127 * fVar127 + fVar119 + -fVar128 * fVar128;
                    fVar138 = fVar103 * fVar128 - fVar76 * fVar127;
                    fVar90 = fVar76 * fVar127 + fVar103 * fVar128;
                    fVar135 = fVar127 * fVar128 + fVar76 * fVar103;
                    fVar76 = fVar127 * fVar128 - fVar76 * fVar103;
                    fVar108 = (pAVar15->p).field_0.m128[0];
                    fVar99 = (pAVar15->p).field_0.m128[1];
                    fVar129 = (pAVar15->p).field_0.m128[2];
                    fVar130 = fVar130 + fVar130;
                    fVar138 = fVar138 + fVar138;
                    fVar101 = fVar101 + fVar101;
                    fVar135 = fVar135 + fVar135;
                    fVar90 = fVar90 + fVar90;
                    fVar76 = fVar76 + fVar76;
                    fVar103 = fVar128 * fVar128 + fVar119 + -fVar127 * fVar127;
                    fVar114 = fVar116 * 1.0 + fVar130 * 0.0 + fVar138 * 0.0;
                    fVar117 = fVar116 * 0.0 + fVar130 * 1.0 + fVar138 * 0.0;
                    fVar120 = fVar116 * 0.0 + fVar130 * 0.0 + fVar138 * 1.0;
                    fVar123 = fVar116 * 0.0 + fVar130 * 0.0 + fVar138 * 0.0;
                    fVar109 = fVar101 * 1.0 + fVar107 * 0.0 + fVar135 * 0.0;
                    fVar110 = fVar101 * 0.0 + fVar107 * 1.0 + fVar135 * 0.0;
                    fVar111 = fVar101 * 0.0 + fVar107 * 0.0 + fVar135 * 1.0;
                    fVar112 = fVar101 * 0.0 + fVar107 * 0.0 + fVar135 * 0.0;
                    fVar91 = fVar90 * 1.0 + fVar76 * 0.0 + fVar103 * 0.0;
                    fVar93 = fVar90 * 0.0 + fVar76 * 1.0 + fVar103 * 0.0;
                    fVar95 = fVar90 * 0.0 + fVar76 * 0.0 + fVar103 * 1.0;
                    fVar97 = fVar90 * 0.0 + fVar76 * 0.0 + fVar103 * 0.0;
                    local_188 = aVar9.y;
                    fStack_184 = aVar9.z;
                    local_168 = aVar9.x;
                    fVar131 = local_168 * fVar114 + fVar109 * 0.0 + fVar91 * 0.0;
                    fVar132 = local_168 * fVar117 + fVar110 * 0.0 + fVar93 * 0.0;
                    fVar133 = local_168 * fVar120 + fVar111 * 0.0 + fVar95 * 0.0;
                    fVar134 = local_168 * fVar123 + fVar112 * 0.0 + fVar97 * 0.0;
                    fVar92 = fVar113 * fVar114 + fVar122 * fVar109 + fVar91 * 0.0;
                    fVar94 = fVar113 * fVar117 + fVar122 * fVar110 + fVar93 * 0.0;
                    fVar96 = fVar113 * fVar120 + fVar122 * fVar111 + fVar95 * 0.0;
                    fVar98 = fVar113 * fVar123 + fVar122 * fVar112 + fVar97 * 0.0;
                    fVar130 = fVar104 * fVar114 + fVar106 * fVar109 + fVar100 * fVar91;
                    fVar135 = fVar104 * fVar117 + fVar106 * fVar110 + fVar100 * fVar93;
                    fVar138 = fVar104 * fVar120 + fVar106 * fVar111 + fVar100 * fVar95;
                    fVar89 = fVar104 * fVar123 + fVar106 * fVar112 + fVar100 * fVar97;
                    fVar76 = *(float *)(lVar16 + 0xc + lVar68);
                    fVar103 = *(float *)(lVar16 + -0x24 + lVar68);
                    fVar127 = *(float *)(lVar16 + -0x14 + lVar68);
                    fVar128 = *(float *)(lVar16 + -4 + lVar68);
                    fVar119 = fVar103 * fVar127 + fVar76 * fVar128;
                    fVar101 = fVar103 * fVar127 - fVar76 * fVar128;
                    fVar116 = fVar76 * fVar76 + fVar103 * fVar103 + -fVar127 * fVar127 +
                              -fVar128 * fVar128;
                    fVar122 = fVar76 * fVar76 - fVar103 * fVar103;
                    fVar137 = fVar127 * fVar127 + fVar122 + -fVar128 * fVar128;
                    fVar136 = fVar103 * fVar128 - fVar76 * fVar127;
                    fVar105 = fVar76 * fVar127 + fVar103 * fVar128;
                    fVar139 = fVar127 * fVar128 + fVar76 * fVar103;
                    fVar90 = fVar127 * fVar128 - fVar76 * fVar103;
                    pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                    fVar76 = *pfVar3;
                    pfVar4 = (float *)(lVar16 + -0x20 + lVar68);
                    fVar103 = *pfVar4;
                    fVar113 = pfVar4[1];
                    fVar124 = fVar128 * fVar128 + fVar122 + -fVar127 * fVar127;
                    pfVar5 = (float *)(lVar16 + -0x10 + lVar68);
                    fVar127 = *pfVar5;
                    fVar128 = pfVar5[1];
                    fVar122 = pfVar5[2];
                    fVar119 = fVar119 + fVar119;
                    fVar136 = fVar136 + fVar136;
                    pfVar5 = (float *)(lVar16 + lVar68);
                    fVar104 = *pfVar5;
                    fVar106 = pfVar5[1];
                    fVar100 = pfVar5[2];
                    fVar107 = fVar116 * 1.0 + fVar119 * 0.0 + fVar136 * 0.0;
                    fVar102 = fVar116 * 0.0 + fVar119 * 1.0 + fVar136 * 0.0;
                    fVar136 = fVar116 * 0.0 + fVar119 * 0.0 + fVar136 * 1.0;
                    fVar101 = fVar101 + fVar101;
                    fVar139 = fVar139 + fVar139;
                    fVar105 = fVar105 + fVar105;
                    fVar90 = fVar90 + fVar90;
                    fVar116 = fVar101 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                    fVar119 = fVar101 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                    fVar101 = fVar101 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                    fVar137 = fVar105 * 1.0 + fVar90 * 0.0 + fVar124 * 0.0;
                    fVar139 = fVar105 * 0.0 + fVar90 * 1.0 + fVar124 * 0.0;
                    fVar105 = fVar105 * 0.0 + fVar90 * 0.0 + fVar124 * 1.0;
                    fVar115 = fVar76 * fVar107 + fVar116 * 0.0 + fVar137 * 0.0;
                    fVar118 = fVar76 * fVar102 + fVar119 * 0.0 + fVar139 * 0.0;
                    fVar121 = fVar76 * fVar136 + fVar101 * 0.0 + fVar105 * 0.0;
                    fVar76 = fVar103 * fVar107 + fVar113 * fVar116 + fVar137 * 0.0;
                    fVar90 = fVar103 * fVar102 + fVar113 * fVar119 + fVar139 * 0.0;
                    fVar124 = fVar103 * fVar136 + fVar113 * fVar101 + fVar105 * 0.0;
                    fVar125 = fVar127 * fVar107 + fVar128 * fVar116 + fVar122 * fVar137;
                    fVar126 = fVar127 * fVar102 + fVar128 * fVar119 + fVar122 * fVar139;
                    fVar127 = fVar127 * fVar136 + fVar128 * fVar101 + fVar122 * fVar105;
                    fVar137 = fVar104 * fVar107 + fVar106 * fVar116 + fVar100 * fVar137 +
                              pfVar3[1] + 0.0;
                    fVar102 = fVar104 * fVar102 + fVar106 * fVar119 + fVar100 * fVar139 +
                              pfVar3[2] + 0.0;
                    fVar136 = fVar104 * fVar136 + fVar106 * fVar101 + fVar100 * fVar105 +
                              pfVar4[2] + 0.0;
                    fVar101 = fVar115 * fVar131 + fVar118 * fVar92 + fVar121 * fVar130;
                    local_168 = fVar115 * fVar132 + fVar118 * fVar94 + fVar121 * fVar135;
                    fVar103 = fVar115 * fVar133 + fVar118 * fVar96 + fVar121 * fVar138;
                    fVar113 = fVar76 * fVar131 + fVar90 * fVar92 + fVar124 * fVar130;
                    fVar116 = fVar76 * fVar132 + fVar90 * fVar94 + fVar124 * fVar135;
                    fVar119 = fVar76 * fVar133 + fVar90 * fVar96 + fVar124 * fVar138;
                    fVar122 = fVar76 * fVar134 + fVar90 * fVar98 + fVar124 * fVar89;
                    fVar104 = fVar125 * fVar131 + fVar126 * fVar92 + fVar127 * fVar130;
                    fVar106 = fVar125 * fVar132 + fVar126 * fVar94 + fVar127 * fVar135;
                    fVar107 = fVar125 * fVar133 + fVar126 * fVar96 + fVar127 * fVar138;
                    psVar67 = extraout_RDX_00;
                    fVar100 = fVar125 * fVar134 + fVar126 * fVar98 + fVar127 * fVar89;
                    fVar76 = fVar115 * fVar134 + fVar118 * fVar98 + fVar121 * fVar89;
                    fVar127 = fVar137 * fVar131 + fVar102 * fVar92 + fVar136 * fVar130 +
                              fVar108 * fVar114 + fVar99 * fVar109 + fVar129 * fVar91 +
                              local_188 + 0.0;
                    fVar128 = fVar137 * fVar132 + fVar102 * fVar94 + fVar136 * fVar135 +
                              fVar108 * fVar117 + fVar99 * fVar110 + fVar129 * fVar93 +
                              fStack_184 + 0.0;
                    fVar90 = fVar137 * fVar133 + fVar102 * fVar96 + fVar136 * fVar138 +
                             fVar108 * fVar120 + fVar99 * fVar111 + fVar129 * fVar95 +
                             (pAVar15->l).vy.field_0.m128[2] + 0.0;
                    fVar108 = fVar137 * fVar134 + fVar102 * fVar98 + fVar136 * fVar89 +
                              fVar108 * fVar123 + fVar99 * fVar112 + fVar129 * fVar97 + 0.0;
                  }
                }
                else {
                  auVar18._4_4_ = -(uint)((pAVar15->l).vy.field_0.m128[0] != 0.0);
                  auVar18._0_4_ = -(uint)((pAVar15->l).vx.field_0.m128[3] != 0.0);
                  auVar18._8_4_ = -(uint)((pAVar15->l).vy.field_0.m128[1] != 1.0);
                  auVar18._12_4_ = -(uint)((pAVar15->l).vy.field_0.m128[2] != 0.0);
                  uVar72 = movmskps(uVar72,auVar18);
                  if ((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                     (((uVar72 & 4) != 0 ||
                      (bVar66 = ((byte)uVar72 & 8) >> 3,
                      uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66), bVar66 != 0))))
                  goto LAB_00167930;
                  auVar19._4_4_ = -(uint)((pAVar15->l).vz.field_0.m128[0] != 0.0);
                  auVar19._0_4_ = -(uint)((pAVar15->l).vy.field_0.m128[3] != 0.0);
                  auVar19._8_4_ = -(uint)((pAVar15->l).vz.field_0.m128[1] != 0.0);
                  auVar19._12_4_ = -(uint)((pAVar15->l).vz.field_0.m128[2] != 1.0);
                  uVar72 = movmskps(uVar72,auVar19);
                  if (((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                      ((uVar72 & 4) != 0)) ||
                     (bVar66 = ((byte)uVar72 & 8) >> 3,
                     uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66), bVar66 != 0)) goto LAB_00167930;
                  auVar20._4_4_ = -(uint)((pAVar15->p).field_0.m128[0] != 0.0);
                  auVar20._0_4_ = -(uint)((pAVar15->l).vz.field_0.m128[3] != 0.0);
                  auVar20._8_4_ = -(uint)((pAVar15->p).field_0.m128[1] != 0.0);
                  auVar20._12_4_ = -(uint)((pAVar15->p).field_0.m128[2] != 0.0);
                  uVar72 = movmskps(uVar72,auVar20);
                  if ((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) || ((uVar72 & 4) != 0)
                     ) goto LAB_00167930;
                  bVar66 = ((byte)uVar72 & 8) >> 3;
                  uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                  psVar67 = (size_t *)(ulong)uVar72;
                  if ((bVar66 != 0) ||
                     ((bVar11 != 0 &&
                      ((fVar76 = (pAVar15->p).field_0.m128[3], fVar76 != 1.0 || (NAN(fVar76)))))))
                  goto LAB_00167930;
                  pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                  fVar101 = *pfVar3;
                  local_168 = pfVar3[1];
                  fVar103 = pfVar3[2];
                  fVar76 = pfVar3[3];
                  pfVar3 = (float *)(lVar16 + -0x20 + lVar68);
                  fVar113 = *pfVar3;
                  fVar116 = pfVar3[1];
                  fVar119 = pfVar3[2];
                  fVar122 = pfVar3[3];
                  pfVar3 = (float *)(lVar16 + -0x10 + lVar68);
                  fVar104 = *pfVar3;
                  fVar106 = pfVar3[1];
                  fVar107 = pfVar3[2];
                  fVar100 = pfVar3[3];
                  pfVar3 = (float *)(lVar16 + lVar68);
                  fVar127 = *pfVar3;
                  fVar128 = pfVar3[1];
                  fVar90 = pfVar3[2];
                  fVar108 = pfVar3[3];
                  local_158.quaternion = (bool)bVar12;
                }
LAB_001683e9:
                pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x30);
                *pfVar3 = fVar101;
                pfVar3[1] = local_168;
                pfVar3[2] = fVar103;
                pfVar3[3] = fVar76;
                pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x20);
                *pfVar3 = fVar113;
                pfVar3[1] = fVar116;
                pfVar3[2] = fVar119;
                pfVar3[3] = fVar122;
                pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x10);
                *pfVar3 = fVar104;
                pfVar3[1] = fVar106;
                pfVar3[2] = fVar107;
                pfVar3[3] = fVar100;
                pfVar3 = (float *)((long)&((local_158.spaces.items)->l).vx.field_0 + lVar68);
                *pfVar3 = fVar127;
                pfVar3[1] = fVar128;
                pfVar3[2] = fVar90;
                pfVar3[3] = fVar108;
                uVar70 = uVar70 + 1;
                lVar68 = lVar68 + 0x40;
                pAVar61 = local_158.spaces.items;
              } while (uVar70 < (ulong)plVar60[0xf]);
            }
          }
          else if (plVar60[0xf] == 1) {
            uVar8 = *(undefined8 *)&(pLVar2->vx).field_0;
            fVar76 = (float)uVar8;
            fVar103 = (float)((ulong)uVar8 >> 0x20);
            fVar127 = (float)plVar60[0xd];
            fVar128 = (float)((ulong)plVar60[0xd] >> 0x20);
            uVar72 = -(uint)(fVar76 < fVar127);
            uVar74 = -(uint)(fVar103 < fVar128);
            local_158.time_range.upper = (float)(~uVar74 & (uint)fVar128 | (uint)fVar103 & uVar74);
            local_158.time_range.lower = (float)(~uVar72 & (uint)fVar76 | (uint)fVar127 & uVar72);
            local_158.spaces.size_active = 0;
            local_158.spaces.size_alloced = 0;
            local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            if (sVar14 != 0) {
              local_158.spaces.items =
                   (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                   alignedMalloc(sVar14 << 6,0x10);
              psVar67 = extraout_RDX_03;
              local_158.spaces.size_alloced = sVar14;
            }
            pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
            if (*(undefined1 *)((long)&(pLVar2->vz).field_0 + 8) == '\0') {
              pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                        (ulong)*(uint *)(plVar60 + 0x12);
            }
            local_158.quaternion = SUB81(pAVar61,0);
            local_158.spaces.size_active = local_158.spaces.size_alloced;
            if (*(size_t *)&(pLVar2->vy).field_0 != 0) {
              lVar68 = 0x30;
              uVar70 = 0;
              do {
                uVar72 = (uint)psVar67;
                pAVar15 = *(AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **)
                           &(pLVar2->vz).field_0;
                pfVar3 = (float *)plVar60[0x11];
                bVar11 = *(undefined1 *)((long)&(pLVar2->vz).field_0 + 8);
                bVar12 = *(byte *)(plVar60 + 0x12);
                local_158.quaternion = false;
                fVar76 = *(float *)((long)pAVar15 + lVar68 + -0x30);
                uVar8 = *(undefined8 *)((long)pAVar15 + lVar68 + -0x2c);
                fVar103 = (float)((ulong)uVar8 >> 0x20);
                local_168 = (float)uVar8;
                if ((((fVar76 != 1.0) || (NAN(fVar76))) || (local_168 != 0.0)) ||
                   (((NAN(local_168) || (fVar103 != 0.0)) || (NAN(fVar103))))) {
LAB_001685f6:
                  fVar127 = (float)*(undefined8 *)pfVar3;
                  fVar128 = (float)((ulong)*(undefined8 *)pfVar3 >> 0x20);
                  iVar73 = -(uint)(fVar127 != 1.0);
                  iVar75 = -(uint)(fVar128 != 0.0);
                  auVar80._4_4_ = iVar75;
                  auVar80._0_4_ = iVar73;
                  auVar80._8_4_ = iVar75;
                  auVar80._12_4_ = iVar75;
                  auVar79._8_8_ = auVar80._8_8_;
                  auVar79._4_4_ = iVar73;
                  auVar79._0_4_ = iVar73;
                  uVar72 = movmskpd(uVar72,auVar79);
                  psVar67 = (size_t *)(ulong)uVar72;
                  fVar76 = pfVar3[2];
                  if ((uVar72 & 1) == 0) {
                    bVar66 = (byte)uVar72 >> 1;
                    uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                    psVar67 = (size_t *)(ulong)uVar72;
                    if (((bVar66 == 0) && (fVar76 == 0.0)) && (!NAN(fVar76))) {
                      auVar44._4_4_ = -(uint)(pfVar3[4] != 0.0);
                      auVar44._0_4_ = -(uint)(pfVar3[3] != 0.0);
                      auVar44._8_4_ = -(uint)(pfVar3[5] != 1.0);
                      auVar44._12_4_ = -(uint)(pfVar3[6] != 0.0);
                      uVar72 = movmskps(uVar72,auVar44);
                      psVar67 = (size_t *)(ulong)uVar72;
                      if ((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                         ((uVar72 & 4) == 0)) {
                        bVar66 = ((byte)uVar72 & 8) >> 3;
                        uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                        psVar67 = (size_t *)(ulong)uVar72;
                        if (bVar66 == 0) {
                          auVar45._4_4_ = -(uint)(pfVar3[8] != 0.0);
                          auVar45._0_4_ = -(uint)(pfVar3[7] != 0.0);
                          auVar45._8_4_ = -(uint)(pfVar3[9] != 0.0);
                          auVar45._12_4_ = -(uint)(pfVar3[10] != 1.0);
                          uVar72 = movmskps(uVar72,auVar45);
                          psVar67 = (size_t *)(ulong)uVar72;
                          if ((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                             ((uVar72 & 4) == 0)) {
                            bVar66 = ((byte)uVar72 & 8) >> 3;
                            uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                            psVar67 = (size_t *)(ulong)uVar72;
                            if (bVar66 == 0) {
                              auVar46._4_4_ = -(uint)(pfVar3[0xc] != 0.0);
                              auVar46._0_4_ = -(uint)(pfVar3[0xb] != 0.0);
                              auVar46._8_4_ = -(uint)(pfVar3[0xd] != 0.0);
                              auVar46._12_4_ = -(uint)(pfVar3[0xe] != 0.0);
                              uVar72 = movmskps(uVar72,auVar46);
                              psVar67 = (size_t *)(ulong)uVar72;
                              if ((((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                                   ((uVar72 & 4) == 0)) &&
                                  (bVar66 = ((byte)uVar72 & 8) >> 3,
                                  psVar67 = (size_t *)(ulong)CONCAT31((int3)(uVar72 >> 8),bVar66),
                                  bVar66 == 0)) &&
                                 ((bVar12 == 0 || ((pfVar3[0xf] == 1.0 && (!NAN(pfVar3[0xf]))))))) {
                                pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x30);
                                fVar101 = *pfVar3;
                                local_168 = pfVar3[1];
                                fVar103 = pfVar3[2];
                                fVar76 = pfVar3[3];
                                pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x20);
                                fVar113 = *pfVar3;
                                fVar116 = pfVar3[1];
                                fVar119 = pfVar3[2];
                                fVar122 = pfVar3[3];
                                pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x10);
                                fVar104 = *pfVar3;
                                fVar106 = pfVar3[1];
                                fVar107 = pfVar3[2];
                                fVar100 = pfVar3[3];
                                pfVar3 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar68);
                                fVar127 = *pfVar3;
                                fVar128 = pfVar3[1];
                                fVar90 = pfVar3[2];
                                fVar108 = pfVar3[3];
                                local_158.quaternion = (bool)bVar11;
                                goto LAB_001690c7;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  if ((bVar11 == 0) && (bVar12 == 0)) {
                    pfVar4 = (float *)((long)pAVar15 + lVar68 + -0x30);
                    fVar135 = *pfVar4;
                    fVar138 = pfVar4[1];
                    fVar89 = pfVar4[2];
                    fVar91 = pfVar4[3];
                    pfVar4 = (float *)((long)pAVar15 + lVar68 + -0x20);
                    fVar92 = *pfVar4;
                    fVar93 = pfVar4[1];
                    fVar94 = pfVar4[2];
                    fVar95 = pfVar4[3];
                    pfVar4 = (float *)((long)pAVar15 + lVar68 + -0x10);
                    fVar96 = *pfVar4;
                    fVar97 = pfVar4[1];
                    fVar98 = pfVar4[2];
                    fVar102 = pfVar4[3];
                    fVar101 = fVar127 * fVar135 + fVar128 * fVar92 + fVar76 * fVar96;
                    local_168 = fVar127 * fVar138 + fVar128 * fVar93 + fVar76 * fVar97;
                    fVar103 = fVar127 * fVar89 + fVar128 * fVar94 + fVar76 * fVar98;
                    fVar122 = pfVar3[4];
                    fVar104 = pfVar3[5];
                    fVar106 = pfVar3[6];
                    fVar100 = pfVar3[8];
                    fVar113 = fVar122 * fVar135 + fVar104 * fVar92 + fVar106 * fVar96;
                    fVar116 = fVar122 * fVar138 + fVar104 * fVar93 + fVar106 * fVar97;
                    fVar119 = fVar122 * fVar89 + fVar104 * fVar94 + fVar106 * fVar98;
                    fVar122 = fVar122 * fVar91 + fVar104 * fVar95 + fVar106 * fVar102;
                    fVar90 = pfVar3[9];
                    fVar108 = pfVar3[10];
                    fVar104 = fVar100 * fVar135 + fVar90 * fVar92 + fVar108 * fVar96;
                    fVar106 = fVar100 * fVar138 + fVar90 * fVar93 + fVar108 * fVar97;
                    fVar107 = fVar100 * fVar89 + fVar90 * fVar94 + fVar108 * fVar98;
                    fVar99 = pfVar3[0xc];
                    fVar129 = pfVar3[0xd];
                    fVar130 = pfVar3[0xe];
                    pfVar3 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar68);
                    fVar100 = fVar100 * fVar91 + fVar90 * fVar95 + fVar108 * fVar102;
                    fVar76 = fVar127 * fVar91 + fVar128 * fVar95 + fVar76 * fVar102;
                    fVar127 = fVar99 * fVar135 + fVar129 * fVar92 + fVar130 * fVar96 + *pfVar3;
                    fVar128 = fVar99 * fVar138 + fVar129 * fVar93 + fVar130 * fVar97 + pfVar3[1];
                    fVar90 = fVar99 * fVar89 + fVar129 * fVar94 + fVar130 * fVar98 + pfVar3[2];
                    fVar108 = fVar99 * fVar91 + fVar129 * fVar95 + fVar130 * fVar102 + pfVar3[3];
                  }
                  else if ((bVar11 == 0) || (bVar12 == 0)) {
                    if ((bVar11 == 0) || (bVar12 != 0)) {
                      if ((local_168 != 0.0) ||
                         ((((NAN(local_168) || (fVar103 != 0.0)) || (NAN(fVar103))) ||
                          (uVar8 = *(undefined8 *)((long)pAVar15 + lVar68 + -0x10),
                          auVar25._4_4_ = -(uint)(*(float *)((long)pAVar15 + lVar68 + -0x20) != 0.0)
                          , auVar25._0_4_ =
                                 -(uint)(*(float *)((long)pAVar15 + lVar68 + -0x18) != 0.0),
                          auVar25._8_4_ = -(uint)((float)uVar8 != 0.0),
                          auVar25._12_4_ = -(uint)((float)((ulong)uVar8 >> 0x20) != 0.0),
                          uVar59 = movmskps((int)CONCAT71((int7)((ulong)pAVar61 >> 8),bVar12),
                                            auVar25), (char)uVar59 != '\0')))) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                   ,0x83);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                        std::ostream::put(-0x30);
                        std::ostream::flush();
                        psVar67 = extraout_RDX_06;
                      }
                      fVar76 = pfVar3[3];
                      fVar113 = pfVar3[4];
                      fVar122 = pfVar3[7];
                      fVar104 = pfVar3[8];
                      fVar106 = pfVar3[9];
                      fVar100 = pfVar3[0xb];
                      fVar127 = pfVar3[0xc];
                      fVar128 = pfVar3[0xd];
                      fVar90 = pfVar3[0xe];
                      fVar108 = pfVar3[0xf];
                      uVar8 = *(undefined8 *)((long)&(pAVar15->l).vx.field_0 + lVar68);
                      fVar101 = *(float *)((long)pAVar15 + lVar68 + -0x30) * *pfVar3;
                      local_168 = pfVar3[1] + (float)uVar8;
                      fVar103 = pfVar3[2] + (float)((ulong)uVar8 >> 0x20);
                      fVar119 = pfVar3[6] + *(float *)((long)&(pAVar15->l).vx.field_0 + lVar68 + 8);
                      fVar116 = pfVar3[5] * *(float *)((long)pAVar15 + lVar68 + -0x1c);
                      fVar107 = pfVar3[10] * *(float *)((long)pAVar15 + lVar68 + -8);
                      local_158.quaternion = true;
                    }
                    else {
                      local_d8 = ZEXT416(*(uint *)((long)&(pAVar15->l).vx.field_0 + lVar68 + 0xc));
                      _local_b8 = ZEXT416(*(uint *)((long)pAVar15 + lVar68 + -0x24));
                      local_e8 = ZEXT416(*(uint *)((long)pAVar15 + lVar68 + -4));
                      pfVar4 = (float *)((long)pAVar15 + lVar68 + -0x20);
                      fVar119 = *pfVar4;
                      fVar107 = pfVar4[1];
                      pfVar5 = (float *)((long)pAVar15 + lVar68 + -0x10);
                      local_108 = *pfVar5;
                      fStack_104 = pfVar5[1];
                      fStack_100 = pfVar5[2];
                      fStack_fc = pfVar5[3];
                      local_c8._8_8_ = 0;
                      local_c8._0_8_ = *(ulong *)((long)pAVar15 + lVar68 + -0x18);
                      pfVar5 = (float *)((long)pAVar15 + lVar68 + -0x30);
                      local_128 = *pfVar5;
                      fStack_11c = pfVar5[1];
                      fVar76 = *pfVar3;
                      fVar127 = pfVar3[1];
                      fVar128 = pfVar3[2];
                      fVar122 = pfVar3[4];
                      fVar104 = pfVar3[5];
                      fVar106 = pfVar3[6];
                      local_118 = *(undefined8 *)(pfVar3 + 8);
                      uStack_110 = *(undefined8 *)(pfVar3 + 10);
                      fVar100 = pfVar3[0xc];
                      fVar90 = pfVar3[0xd];
                      fVar108 = pfVar3[0xe];
                      fVar101 = fVar76 * local_128 + fVar127 * fVar119 + fVar128 * local_108;
                      fVar99 = fVar76 * 0.0 + fVar127 * fVar107 + fVar128 * fStack_104;
                      fVar127 = fVar76 * 0.0 + fVar127 * 0.0 + fVar128 * fStack_100;
                      fVar113 = fVar122 * local_128 + fVar104 * fVar119 + fVar106 * local_108;
                      fVar116 = fVar122 * 0.0 + fVar104 * fVar107 + fVar106 * fStack_104;
                      fVar76 = fVar122 * 0.0 + fVar104 * 0.0 + fVar106 * fStack_100;
                      fStack_f0 = 0.0;
                      local_f8 = (undefined1  [8])*(ulong *)pfVar4;
                      fStack_ec = pfVar4[3];
                      fStack_124 = 0.0;
                      fStack_120 = 0.0;
                      pfVar3 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar68);
                      local_a8 = fVar100 * local_128 + fVar90 * fVar119 + fVar108 * local_108 +
                                 *pfVar3;
                      fStack_a4 = fVar100 * 0.0 + fVar90 * fVar107 + fVar108 * fStack_104 +
                                  pfVar3[1];
                      fStack_a0 = fVar100 * 0.0 + fVar90 * 0.0 + fVar108 * fStack_100 + pfVar3[2];
                      fStack_9c = fVar100 * fStack_11c + fVar90 * pfVar4[3] + fVar108 * fStack_fc +
                                  pfVar3[3];
                      if ((((fVar99 != 0.0) || (NAN(fVar99))) ||
                          ((fVar127 != 0.0 || ((NAN(fVar127) || (fVar76 != 0.0)))))) ||
                         (NAN(fVar76))) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                   ,0x61);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                        std::ostream::put(-0x30);
                        std::ostream::flush();
                        psVar67 = extraout_RDX_05;
                      }
                      fVar104 = local_128 * (float)local_118 +
                                (float)local_f8._0_4_ * local_118._4_4_ +
                                local_108 * (float)uStack_110;
                      fVar106 = fStack_124 * (float)local_118 +
                                (float)local_f8._4_4_ * local_118._4_4_ +
                                fStack_104 * (float)uStack_110;
                      fVar107 = fStack_120 * (float)local_118 +
                                fStack_f0 * local_118._4_4_ + fStack_100 * (float)uStack_110;
                      local_158.quaternion = true;
                      fVar119 = local_c8._0_4_;
                      fVar122 = local_c8._4_4_;
                      fVar100 = (float)local_e8._0_4_;
                      fVar76 = (float)local_b8._0_4_;
                      fVar127 = local_a8;
                      fVar128 = fStack_a4;
                      fVar90 = fStack_a0;
                      fVar108 = (float)local_d8._0_4_;
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                               ,0x67);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                    std::ostream::put(-0x30);
                    std::ostream::flush();
                    fVar76 = *(float *)((long)&(pAVar15->l).vx.field_0 + lVar68 + 0xc);
                    fVar103 = *(float *)((long)pAVar15 + lVar68 + -0x24);
                    fVar127 = *(float *)((long)pAVar15 + lVar68 + -0x14);
                    fVar128 = *(float *)((long)pAVar15 + lVar68 + -4);
                    auVar10 = *(undefined1 (*) [16])((long)pAVar15 + lVar68 + -0x30);
                    pfVar4 = (float *)((long)pAVar15 + lVar68 + -0x20);
                    fVar113 = *pfVar4;
                    fVar122 = pfVar4[1];
                    pfVar5 = (float *)((long)pAVar15 + lVar68 + -0x10);
                    fVar104 = *pfVar5;
                    fVar106 = pfVar5[1];
                    fVar100 = pfVar5[2];
                    fVar130 = fVar103 * fVar127 + fVar76 * fVar128;
                    fVar101 = fVar103 * fVar127 - fVar76 * fVar128;
                    fVar116 = fVar76 * fVar76 + fVar103 * fVar103 + -fVar127 * fVar127 +
                              -fVar128 * fVar128;
                    fVar119 = fVar76 * fVar76 - fVar103 * fVar103;
                    fVar107 = fVar127 * fVar127 + fVar119 + -fVar128 * fVar128;
                    fVar138 = fVar103 * fVar128 - fVar76 * fVar127;
                    fVar90 = fVar76 * fVar127 + fVar103 * fVar128;
                    fVar135 = fVar127 * fVar128 + fVar76 * fVar103;
                    fVar76 = fVar127 * fVar128 - fVar76 * fVar103;
                    pfVar5 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar68);
                    fVar108 = *pfVar5;
                    fVar99 = pfVar5[1];
                    fVar129 = pfVar5[2];
                    fVar130 = fVar130 + fVar130;
                    fVar138 = fVar138 + fVar138;
                    fVar101 = fVar101 + fVar101;
                    fVar135 = fVar135 + fVar135;
                    fVar90 = fVar90 + fVar90;
                    fVar76 = fVar76 + fVar76;
                    fVar103 = fVar128 * fVar128 + fVar119 + -fVar127 * fVar127;
                    fVar114 = fVar116 * 1.0 + fVar130 * 0.0 + fVar138 * 0.0;
                    fVar117 = fVar116 * 0.0 + fVar130 * 1.0 + fVar138 * 0.0;
                    fVar120 = fVar116 * 0.0 + fVar130 * 0.0 + fVar138 * 1.0;
                    fVar123 = fVar116 * 0.0 + fVar130 * 0.0 + fVar138 * 0.0;
                    fVar109 = fVar101 * 1.0 + fVar107 * 0.0 + fVar135 * 0.0;
                    fVar110 = fVar101 * 0.0 + fVar107 * 1.0 + fVar135 * 0.0;
                    fVar111 = fVar101 * 0.0 + fVar107 * 0.0 + fVar135 * 1.0;
                    fVar112 = fVar101 * 0.0 + fVar107 * 0.0 + fVar135 * 0.0;
                    fVar91 = fVar90 * 1.0 + fVar76 * 0.0 + fVar103 * 0.0;
                    fVar93 = fVar90 * 0.0 + fVar76 * 1.0 + fVar103 * 0.0;
                    fVar95 = fVar90 * 0.0 + fVar76 * 0.0 + fVar103 * 1.0;
                    fVar97 = fVar90 * 0.0 + fVar76 * 0.0 + fVar103 * 0.0;
                    local_188 = auVar10._4_4_;
                    fStack_184 = auVar10._8_4_;
                    local_168 = auVar10._0_4_;
                    fVar131 = local_168 * fVar114 + fVar109 * 0.0 + fVar91 * 0.0;
                    fVar132 = local_168 * fVar117 + fVar110 * 0.0 + fVar93 * 0.0;
                    fVar133 = local_168 * fVar120 + fVar111 * 0.0 + fVar95 * 0.0;
                    fVar134 = local_168 * fVar123 + fVar112 * 0.0 + fVar97 * 0.0;
                    fVar92 = fVar113 * fVar114 + fVar122 * fVar109 + fVar91 * 0.0;
                    fVar94 = fVar113 * fVar117 + fVar122 * fVar110 + fVar93 * 0.0;
                    fVar96 = fVar113 * fVar120 + fVar122 * fVar111 + fVar95 * 0.0;
                    fVar98 = fVar113 * fVar123 + fVar122 * fVar112 + fVar97 * 0.0;
                    fVar130 = fVar104 * fVar114 + fVar106 * fVar109 + fVar100 * fVar91;
                    fVar135 = fVar104 * fVar117 + fVar106 * fVar110 + fVar100 * fVar93;
                    fVar138 = fVar104 * fVar120 + fVar106 * fVar111 + fVar100 * fVar95;
                    fVar89 = fVar104 * fVar123 + fVar106 * fVar112 + fVar100 * fVar97;
                    fVar76 = pfVar3[0xf];
                    fVar103 = pfVar3[3];
                    fVar127 = pfVar3[7];
                    fVar128 = pfVar3[0xb];
                    fVar119 = fVar103 * fVar127 + fVar76 * fVar128;
                    fVar101 = fVar103 * fVar127 - fVar76 * fVar128;
                    fVar116 = fVar76 * fVar76 + fVar103 * fVar103 + -fVar127 * fVar127 +
                              -fVar128 * fVar128;
                    fVar122 = fVar76 * fVar76 - fVar103 * fVar103;
                    fVar137 = fVar127 * fVar127 + fVar122 + -fVar128 * fVar128;
                    fVar136 = fVar103 * fVar128 - fVar76 * fVar127;
                    fVar105 = fVar76 * fVar127 + fVar103 * fVar128;
                    fVar139 = fVar127 * fVar128 + fVar76 * fVar103;
                    fVar90 = fVar127 * fVar128 - fVar76 * fVar103;
                    fVar76 = *pfVar3;
                    fVar103 = pfVar3[4];
                    fVar113 = pfVar3[5];
                    fVar124 = fVar128 * fVar128 + fVar122 + -fVar127 * fVar127;
                    fVar127 = pfVar3[8];
                    fVar128 = pfVar3[9];
                    fVar122 = pfVar3[10];
                    fVar119 = fVar119 + fVar119;
                    fVar136 = fVar136 + fVar136;
                    fVar104 = pfVar3[0xc];
                    fVar106 = pfVar3[0xd];
                    fVar100 = pfVar3[0xe];
                    fVar107 = fVar116 * 1.0 + fVar119 * 0.0 + fVar136 * 0.0;
                    fVar102 = fVar116 * 0.0 + fVar119 * 1.0 + fVar136 * 0.0;
                    fVar136 = fVar116 * 0.0 + fVar119 * 0.0 + fVar136 * 1.0;
                    fVar101 = fVar101 + fVar101;
                    fVar139 = fVar139 + fVar139;
                    fVar105 = fVar105 + fVar105;
                    fVar90 = fVar90 + fVar90;
                    fVar116 = fVar101 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                    fVar119 = fVar101 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                    fVar101 = fVar101 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                    fVar137 = fVar105 * 1.0 + fVar90 * 0.0 + fVar124 * 0.0;
                    fVar139 = fVar105 * 0.0 + fVar90 * 1.0 + fVar124 * 0.0;
                    fVar105 = fVar105 * 0.0 + fVar90 * 0.0 + fVar124 * 1.0;
                    fVar115 = fVar76 * fVar107 + fVar116 * 0.0 + fVar137 * 0.0;
                    fVar118 = fVar76 * fVar102 + fVar119 * 0.0 + fVar139 * 0.0;
                    fVar121 = fVar76 * fVar136 + fVar101 * 0.0 + fVar105 * 0.0;
                    fVar76 = fVar103 * fVar107 + fVar113 * fVar116 + fVar137 * 0.0;
                    fVar90 = fVar103 * fVar102 + fVar113 * fVar119 + fVar139 * 0.0;
                    fVar124 = fVar103 * fVar136 + fVar113 * fVar101 + fVar105 * 0.0;
                    fVar125 = fVar127 * fVar107 + fVar128 * fVar116 + fVar122 * fVar137;
                    fVar126 = fVar127 * fVar102 + fVar128 * fVar119 + fVar122 * fVar139;
                    fVar127 = fVar127 * fVar136 + fVar128 * fVar101 + fVar122 * fVar105;
                    fVar137 = fVar104 * fVar107 + fVar106 * fVar116 + fVar100 * fVar137 +
                              pfVar3[1] + 0.0;
                    fVar102 = fVar104 * fVar102 + fVar106 * fVar119 + fVar100 * fVar139 +
                              pfVar3[2] + 0.0;
                    fVar136 = fVar104 * fVar136 + fVar106 * fVar101 + fVar100 * fVar105 +
                              pfVar3[6] + 0.0;
                    fVar101 = fVar115 * fVar131 + fVar118 * fVar92 + fVar121 * fVar130;
                    local_168 = fVar115 * fVar132 + fVar118 * fVar94 + fVar121 * fVar135;
                    fVar103 = fVar115 * fVar133 + fVar118 * fVar96 + fVar121 * fVar138;
                    fVar113 = fVar76 * fVar131 + fVar90 * fVar92 + fVar124 * fVar130;
                    fVar116 = fVar76 * fVar132 + fVar90 * fVar94 + fVar124 * fVar135;
                    fVar119 = fVar76 * fVar133 + fVar90 * fVar96 + fVar124 * fVar138;
                    fVar122 = fVar76 * fVar134 + fVar90 * fVar98 + fVar124 * fVar89;
                    fVar104 = fVar125 * fVar131 + fVar126 * fVar92 + fVar127 * fVar130;
                    fVar106 = fVar125 * fVar132 + fVar126 * fVar94 + fVar127 * fVar135;
                    fVar107 = fVar125 * fVar133 + fVar126 * fVar96 + fVar127 * fVar138;
                    psVar67 = extraout_RDX_04;
                    fVar100 = fVar125 * fVar134 + fVar126 * fVar98 + fVar127 * fVar89;
                    fVar76 = fVar115 * fVar134 + fVar118 * fVar98 + fVar121 * fVar89;
                    fVar127 = fVar137 * fVar131 + fVar102 * fVar92 + fVar136 * fVar130 +
                              fVar108 * fVar114 + fVar99 * fVar109 + fVar129 * fVar91 +
                              local_188 + 0.0;
                    fVar128 = fVar137 * fVar132 + fVar102 * fVar94 + fVar136 * fVar135 +
                              fVar108 * fVar117 + fVar99 * fVar110 + fVar129 * fVar93 +
                              fStack_184 + 0.0;
                    fVar90 = fVar137 * fVar133 + fVar102 * fVar96 + fVar136 * fVar138 +
                             fVar108 * fVar120 + fVar99 * fVar111 + fVar129 * fVar95 +
                             pfVar4[2] + 0.0;
                    fVar108 = fVar137 * fVar134 + fVar102 * fVar98 + fVar136 * fVar89 +
                              fVar108 * fVar123 + fVar99 * fVar112 + fVar129 * fVar97 + 0.0;
                  }
                }
                else {
                  pfVar4 = (float *)((long)pAVar15 + lVar68 + -0x24);
                  auVar22._4_4_ = -(uint)(pfVar4[1] != 0.0);
                  auVar22._0_4_ = -(uint)(*pfVar4 != 0.0);
                  auVar22._8_4_ = -(uint)(pfVar4[2] != 1.0);
                  auVar22._12_4_ = -(uint)(pfVar4[3] != 0.0);
                  uVar72 = movmskps(uVar72,auVar22);
                  if ((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                     (((uVar72 & 4) != 0 ||
                      (bVar66 = ((byte)uVar72 & 8) >> 3,
                      uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66), bVar66 != 0))))
                  goto LAB_001685f6;
                  pfVar4 = (float *)((long)pAVar15 + lVar68 + -0x14);
                  auVar23._4_4_ = -(uint)(pfVar4[1] != 0.0);
                  auVar23._0_4_ = -(uint)(*pfVar4 != 0.0);
                  auVar23._8_4_ = -(uint)(pfVar4[2] != 0.0);
                  auVar23._12_4_ = -(uint)(pfVar4[3] != 1.0);
                  uVar72 = movmskps(uVar72,auVar23);
                  if (((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                      ((uVar72 & 4) != 0)) ||
                     (bVar66 = ((byte)uVar72 & 8) >> 3,
                     uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66), bVar66 != 0)) goto LAB_001685f6;
                  pfVar4 = (float *)((long)pAVar15 + lVar68 + -4);
                  auVar24._4_4_ = -(uint)(pfVar4[1] != 0.0);
                  auVar24._0_4_ = -(uint)(*pfVar4 != 0.0);
                  auVar24._8_4_ = -(uint)(pfVar4[2] != 0.0);
                  auVar24._12_4_ = -(uint)(pfVar4[3] != 0.0);
                  uVar72 = movmskps(uVar72,auVar24);
                  if ((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) || ((uVar72 & 4) != 0)
                     ) goto LAB_001685f6;
                  bVar66 = ((byte)uVar72 & 8) >> 3;
                  uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                  psVar67 = (size_t *)(ulong)uVar72;
                  if ((bVar66 != 0) ||
                     ((bVar11 != 0 &&
                      ((fVar76 = *(float *)((long)&(pAVar15->l).vx.field_0 + lVar68 + 0xc),
                       fVar76 != 1.0 || (NAN(fVar76))))))) goto LAB_001685f6;
                  fVar101 = *pfVar3;
                  local_168 = pfVar3[1];
                  fVar103 = pfVar3[2];
                  fVar76 = pfVar3[3];
                  fVar113 = pfVar3[4];
                  fVar116 = pfVar3[5];
                  fVar119 = pfVar3[6];
                  fVar122 = pfVar3[7];
                  fVar104 = pfVar3[8];
                  fVar106 = pfVar3[9];
                  fVar107 = pfVar3[10];
                  fVar100 = pfVar3[0xb];
                  fVar127 = pfVar3[0xc];
                  fVar128 = pfVar3[0xd];
                  fVar90 = pfVar3[0xe];
                  fVar108 = pfVar3[0xf];
                  local_158.quaternion = (bool)bVar12;
                }
LAB_001690c7:
                pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x30);
                *pfVar3 = fVar101;
                pfVar3[1] = local_168;
                pfVar3[2] = fVar103;
                pfVar3[3] = fVar76;
                pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x20);
                *pfVar3 = fVar113;
                pfVar3[1] = fVar116;
                pfVar3[2] = fVar119;
                pfVar3[3] = fVar122;
                pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x10);
                *pfVar3 = fVar104;
                pfVar3[1] = fVar106;
                pfVar3[2] = fVar107;
                pfVar3[3] = fVar100;
                pfVar3 = (float *)((long)&((local_158.spaces.items)->l).vx.field_0 + lVar68);
                *pfVar3 = fVar127;
                pfVar3[1] = fVar128;
                pfVar3[2] = fVar90;
                pfVar3[3] = fVar108;
                uVar70 = uVar70 + 1;
                lVar68 = lVar68 + 0x40;
                pAVar61 = local_158.spaces.items;
              } while (uVar70 < *(ulong *)&(pLVar2->vy).field_0);
            }
          }
          else {
            if (sVar14 != plVar60[0xf]) {
              prVar64 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar64,"number of transformations does not match");
              __cxa_throw(prVar64,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar8 = *(undefined8 *)&(pLVar2->vx).field_0;
            fVar76 = (float)uVar8;
            fVar103 = (float)((ulong)uVar8 >> 0x20);
            fVar127 = (float)plVar60[0xd];
            fVar128 = (float)((ulong)plVar60[0xd] >> 0x20);
            uVar72 = -(uint)(fVar76 < fVar127);
            uVar74 = -(uint)(fVar103 < fVar128);
            local_158.time_range.upper = (float)(~uVar74 & (uint)fVar128 | (uint)fVar103 & uVar74);
            local_158.time_range.lower = (float)(~uVar72 & (uint)fVar76 | (uint)fVar127 & uVar72);
            local_158.spaces.size_active = 0;
            local_158.spaces.size_alloced = 0;
            local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            if (sVar14 != 0) {
              local_158.spaces.items =
                   (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                   alignedMalloc(sVar14 << 6,0x10);
              psVar67 = extraout_RDX_07;
              local_158.spaces.size_alloced = sVar14;
            }
            pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
            if (*(undefined1 *)((long)&(pLVar2->vz).field_0 + 8) == '\0') {
              pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                        (ulong)*(uint *)(plVar60 + 0x12);
            }
            local_158.quaternion = SUB81(pAVar61,0);
            local_158.spaces.size_active = local_158.spaces.size_alloced;
            if (*(size_t *)&(pLVar2->vy).field_0 != 0) {
              lVar68 = 0x30;
              uVar70 = 0;
              do {
                uVar72 = (uint)psVar67;
                pAVar15 = *(AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **)
                           &(pLVar2->vz).field_0;
                lVar16 = plVar60[0x11];
                bVar11 = *(undefined1 *)((long)&(pLVar2->vz).field_0 + 8);
                bVar12 = *(byte *)(plVar60 + 0x12);
                local_158.quaternion = false;
                fVar76 = *(float *)((long)pAVar15 + lVar68 + -0x30);
                uVar8 = *(undefined8 *)((long)pAVar15 + lVar68 + -0x2c);
                fVar103 = (float)((ulong)uVar8 >> 0x20);
                local_168 = (float)uVar8;
                if (((((fVar76 != 1.0) || (NAN(fVar76))) || (local_168 != 0.0)) ||
                    ((NAN(local_168) || (fVar103 != 0.0)))) || (NAN(fVar103))) {
LAB_001692cf:
                  uVar8 = *(undefined8 *)(lVar16 + -0x30 + lVar68);
                  fVar127 = (float)uVar8;
                  fVar128 = (float)((ulong)uVar8 >> 0x20);
                  iVar73 = -(uint)(fVar127 != 1.0);
                  iVar75 = -(uint)(fVar128 != 0.0);
                  auVar82._4_4_ = iVar75;
                  auVar82._0_4_ = iVar73;
                  auVar82._8_4_ = iVar75;
                  auVar82._12_4_ = iVar75;
                  auVar81._8_8_ = auVar82._8_8_;
                  auVar81._4_4_ = iVar73;
                  auVar81._0_4_ = iVar73;
                  uVar72 = movmskpd(uVar72,auVar81);
                  psVar67 = (size_t *)(ulong)uVar72;
                  fVar76 = *(float *)(lVar16 + -0x28 + lVar68);
                  if ((uVar72 & 1) == 0) {
                    bVar66 = (byte)uVar72 >> 1;
                    uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                    psVar67 = (size_t *)(ulong)uVar72;
                    if (((bVar66 == 0) && (fVar76 == 0.0)) && (!NAN(fVar76))) {
                      pfVar3 = (float *)(lVar16 + -0x24 + lVar68);
                      auVar47._4_4_ = -(uint)(pfVar3[1] != 0.0);
                      auVar47._0_4_ = -(uint)(*pfVar3 != 0.0);
                      auVar47._8_4_ = -(uint)(pfVar3[2] != 1.0);
                      auVar47._12_4_ = -(uint)(pfVar3[3] != 0.0);
                      uVar72 = movmskps(uVar72,auVar47);
                      psVar67 = (size_t *)(ulong)uVar72;
                      if ((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                         ((uVar72 & 4) == 0)) {
                        bVar66 = ((byte)uVar72 & 8) >> 3;
                        uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                        psVar67 = (size_t *)(ulong)uVar72;
                        if (bVar66 == 0) {
                          pfVar3 = (float *)(lVar16 + -0x14 + lVar68);
                          auVar48._4_4_ = -(uint)(pfVar3[1] != 0.0);
                          auVar48._0_4_ = -(uint)(*pfVar3 != 0.0);
                          auVar48._8_4_ = -(uint)(pfVar3[2] != 0.0);
                          auVar48._12_4_ = -(uint)(pfVar3[3] != 1.0);
                          uVar72 = movmskps(uVar72,auVar48);
                          psVar67 = (size_t *)(ulong)uVar72;
                          if ((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                             ((uVar72 & 4) == 0)) {
                            bVar66 = ((byte)uVar72 & 8) >> 3;
                            uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                            psVar67 = (size_t *)(ulong)uVar72;
                            if (bVar66 == 0) {
                              pfVar3 = (float *)(lVar16 + -4 + lVar68);
                              auVar49._4_4_ = -(uint)(pfVar3[1] != 0.0);
                              auVar49._0_4_ = -(uint)(*pfVar3 != 0.0);
                              auVar49._8_4_ = -(uint)(pfVar3[2] != 0.0);
                              auVar49._12_4_ = -(uint)(pfVar3[3] != 0.0);
                              uVar72 = movmskps(uVar72,auVar49);
                              psVar67 = (size_t *)(ulong)uVar72;
                              if ((((((bVar12 & (byte)uVar72) == 0) && ((uVar72 & 2) == 0)) &&
                                   ((uVar72 & 4) == 0)) &&
                                  (bVar66 = ((byte)uVar72 & 8) >> 3,
                                  psVar67 = (size_t *)(ulong)CONCAT31((int3)(uVar72 >> 8),bVar66),
                                  bVar66 == 0)) &&
                                 ((bVar12 == 0 ||
                                  ((fVar113 = *(float *)(lVar16 + 0xc + lVar68), fVar113 == 1.0 &&
                                   (!NAN(fVar113))))))) {
                                pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x30);
                                fVar101 = *pfVar3;
                                local_168 = pfVar3[1];
                                fVar103 = pfVar3[2];
                                fVar76 = pfVar3[3];
                                pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x20);
                                fVar113 = *pfVar3;
                                fVar116 = pfVar3[1];
                                fVar119 = pfVar3[2];
                                fVar122 = pfVar3[3];
                                pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x10);
                                fVar104 = *pfVar3;
                                fVar106 = pfVar3[1];
                                fVar107 = pfVar3[2];
                                fVar100 = pfVar3[3];
                                pfVar3 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar68);
                                fVar127 = *pfVar3;
                                fVar128 = pfVar3[1];
                                fVar90 = pfVar3[2];
                                fVar108 = pfVar3[3];
                                local_158.quaternion = (bool)bVar11;
                                goto LAB_00169dc3;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  if ((bVar11 == 0) && (bVar12 == 0)) {
                    pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x30);
                    fVar135 = *pfVar3;
                    fVar138 = pfVar3[1];
                    fVar89 = pfVar3[2];
                    fVar91 = pfVar3[3];
                    pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x20);
                    fVar92 = *pfVar3;
                    fVar93 = pfVar3[1];
                    fVar94 = pfVar3[2];
                    fVar95 = pfVar3[3];
                    pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x10);
                    fVar96 = *pfVar3;
                    fVar97 = pfVar3[1];
                    fVar98 = pfVar3[2];
                    fVar102 = pfVar3[3];
                    fVar101 = fVar127 * fVar135 + fVar128 * fVar92 + fVar76 * fVar96;
                    local_168 = fVar127 * fVar138 + fVar128 * fVar93 + fVar76 * fVar97;
                    fVar103 = fVar127 * fVar89 + fVar128 * fVar94 + fVar76 * fVar98;
                    fVar122 = *(float *)(lVar16 + -0x20 + lVar68);
                    fVar104 = *(float *)(lVar16 + -0x1c + lVar68);
                    fVar106 = *(float *)(lVar16 + -0x18 + lVar68);
                    fVar100 = *(float *)(lVar16 + -0x10 + lVar68);
                    fVar113 = fVar122 * fVar135 + fVar104 * fVar92 + fVar106 * fVar96;
                    fVar116 = fVar122 * fVar138 + fVar104 * fVar93 + fVar106 * fVar97;
                    fVar119 = fVar122 * fVar89 + fVar104 * fVar94 + fVar106 * fVar98;
                    fVar122 = fVar122 * fVar91 + fVar104 * fVar95 + fVar106 * fVar102;
                    fVar90 = *(float *)(lVar16 + -0xc + lVar68);
                    fVar108 = *(float *)(lVar16 + -8 + lVar68);
                    fVar104 = fVar100 * fVar135 + fVar90 * fVar92 + fVar108 * fVar96;
                    fVar106 = fVar100 * fVar138 + fVar90 * fVar93 + fVar108 * fVar97;
                    fVar107 = fVar100 * fVar89 + fVar90 * fVar94 + fVar108 * fVar98;
                    fVar99 = *(float *)(lVar16 + lVar68);
                    fVar129 = *(float *)(lVar16 + 4 + lVar68);
                    fVar130 = *(float *)(lVar16 + 8 + lVar68);
                    pfVar3 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar68);
                    fVar100 = fVar100 * fVar91 + fVar90 * fVar95 + fVar108 * fVar102;
                    fVar76 = fVar127 * fVar91 + fVar128 * fVar95 + fVar76 * fVar102;
                    fVar127 = fVar99 * fVar135 + fVar129 * fVar92 + fVar130 * fVar96 + *pfVar3;
                    fVar128 = fVar99 * fVar138 + fVar129 * fVar93 + fVar130 * fVar97 + pfVar3[1];
                    fVar90 = fVar99 * fVar89 + fVar129 * fVar94 + fVar130 * fVar98 + pfVar3[2];
                    fVar108 = fVar99 * fVar91 + fVar129 * fVar95 + fVar130 * fVar102 + pfVar3[3];
                  }
                  else if ((bVar11 == 0) || (bVar12 == 0)) {
                    if ((bVar11 == 0) || (bVar12 != 0)) {
                      if ((local_168 != 0.0) ||
                         ((((NAN(local_168) || (fVar103 != 0.0)) || (NAN(fVar103))) ||
                          (uVar8 = *(undefined8 *)((long)pAVar15 + lVar68 + -0x10),
                          auVar28._4_4_ = -(uint)(*(float *)((long)pAVar15 + lVar68 + -0x20) != 0.0)
                          , auVar28._0_4_ =
                                 -(uint)(*(float *)((long)pAVar15 + lVar68 + -0x18) != 0.0),
                          auVar28._8_4_ = -(uint)((float)uVar8 != 0.0),
                          auVar28._12_4_ = -(uint)((float)((ulong)uVar8 >> 0x20) != 0.0),
                          uVar59 = movmskps((int)CONCAT71((int7)((ulong)pAVar61 >> 8),bVar12),
                                            auVar28), (char)uVar59 != '\0')))) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                   ,0x83);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                        std::ostream::put(-0x30);
                        std::ostream::flush();
                        psVar67 = extraout_RDX_10;
                      }
                      pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                      fVar76 = pfVar3[3];
                      pfVar4 = (float *)(lVar16 + -0x20 + lVar68);
                      fVar113 = *pfVar4;
                      fVar122 = pfVar4[3];
                      pfVar5 = (float *)(lVar16 + -0x10 + lVar68);
                      fVar104 = *pfVar5;
                      fVar106 = pfVar5[1];
                      fVar100 = pfVar5[3];
                      pfVar7 = (float *)(lVar16 + lVar68);
                      fVar127 = *pfVar7;
                      fVar128 = pfVar7[1];
                      fVar90 = pfVar7[2];
                      fVar108 = pfVar7[3];
                      uVar8 = *(undefined8 *)((long)&(pAVar15->l).vx.field_0 + lVar68);
                      fVar101 = *(float *)((long)pAVar15 + lVar68 + -0x30) * *pfVar3;
                      local_168 = pfVar3[1] + (float)uVar8;
                      fVar103 = pfVar3[2] + (float)((ulong)uVar8 >> 0x20);
                      fVar119 = pfVar4[2] + *(float *)((long)&(pAVar15->l).vx.field_0 + lVar68 + 8);
                      fVar116 = pfVar4[1] * *(float *)((long)pAVar15 + lVar68 + -0x1c);
                      fVar107 = pfVar5[2] * *(float *)((long)pAVar15 + lVar68 + -8);
                      local_158.quaternion = true;
                    }
                    else {
                      local_d8 = ZEXT416(*(uint *)((long)&(pAVar15->l).vx.field_0 + lVar68 + 0xc));
                      _local_b8 = ZEXT416(*(uint *)((long)pAVar15 + lVar68 + -0x24));
                      local_e8 = ZEXT416(*(uint *)((long)pAVar15 + lVar68 + -4));
                      pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x20);
                      fVar119 = *pfVar3;
                      fVar107 = pfVar3[1];
                      pfVar4 = (float *)((long)pAVar15 + lVar68 + -0x10);
                      local_108 = *pfVar4;
                      fStack_104 = pfVar4[1];
                      fStack_100 = pfVar4[2];
                      fStack_fc = pfVar4[3];
                      local_c8._8_8_ = 0;
                      local_c8._0_8_ = *(ulong *)((long)pAVar15 + lVar68 + -0x18);
                      pfVar4 = (float *)((long)pAVar15 + lVar68 + -0x30);
                      local_128 = *pfVar4;
                      fStack_11c = pfVar4[1];
                      pfVar4 = (float *)(lVar16 + -0x30 + lVar68);
                      fVar76 = *pfVar4;
                      fVar127 = pfVar4[1];
                      fVar128 = pfVar4[2];
                      pfVar4 = (float *)(lVar16 + -0x20 + lVar68);
                      fVar122 = *pfVar4;
                      fVar104 = pfVar4[1];
                      fVar106 = pfVar4[2];
                      puVar69 = (undefined8 *)(lVar16 + -0x10 + lVar68);
                      local_118 = *puVar69;
                      uStack_110 = puVar69[1];
                      pfVar4 = (float *)(lVar16 + lVar68);
                      fVar100 = *pfVar4;
                      fVar90 = pfVar4[1];
                      fVar108 = pfVar4[2];
                      fVar101 = fVar76 * local_128 + fVar127 * fVar119 + fVar128 * local_108;
                      fVar99 = fVar76 * 0.0 + fVar127 * fVar107 + fVar128 * fStack_104;
                      fVar127 = fVar76 * 0.0 + fVar127 * 0.0 + fVar128 * fStack_100;
                      fVar113 = fVar122 * local_128 + fVar104 * fVar119 + fVar106 * local_108;
                      fVar116 = fVar122 * 0.0 + fVar104 * fVar107 + fVar106 * fStack_104;
                      fVar76 = fVar122 * 0.0 + fVar104 * 0.0 + fVar106 * fStack_100;
                      fStack_f0 = 0.0;
                      local_f8 = (undefined1  [8])*(ulong *)pfVar3;
                      fStack_ec = pfVar3[3];
                      fStack_124 = 0.0;
                      fStack_120 = 0.0;
                      pfVar4 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar68);
                      local_a8 = fVar100 * local_128 + fVar90 * fVar119 + fVar108 * local_108 +
                                 *pfVar4;
                      fStack_a4 = fVar100 * 0.0 + fVar90 * fVar107 + fVar108 * fStack_104 +
                                  pfVar4[1];
                      fStack_a0 = fVar100 * 0.0 + fVar90 * 0.0 + fVar108 * fStack_100 + pfVar4[2];
                      fStack_9c = fVar100 * fStack_11c + fVar90 * pfVar3[3] + fVar108 * fStack_fc +
                                  pfVar4[3];
                      if ((((fVar99 != 0.0) || (NAN(fVar99))) ||
                          ((fVar127 != 0.0 || ((NAN(fVar127) || (fVar76 != 0.0)))))) ||
                         (NAN(fVar76))) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                   ,0x61);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                        std::ostream::put(-0x30);
                        std::ostream::flush();
                        psVar67 = extraout_RDX_09;
                      }
                      fVar104 = local_128 * (float)local_118 +
                                (float)local_f8._0_4_ * local_118._4_4_ +
                                local_108 * (float)uStack_110;
                      fVar106 = fStack_124 * (float)local_118 +
                                (float)local_f8._4_4_ * local_118._4_4_ +
                                fStack_104 * (float)uStack_110;
                      fVar107 = fStack_120 * (float)local_118 +
                                fStack_f0 * local_118._4_4_ + fStack_100 * (float)uStack_110;
                      local_158.quaternion = true;
                      fVar119 = local_c8._0_4_;
                      fVar122 = local_c8._4_4_;
                      fVar100 = (float)local_e8._0_4_;
                      fVar76 = (float)local_b8._0_4_;
                      fVar127 = local_a8;
                      fVar128 = fStack_a4;
                      fVar90 = fStack_a0;
                      fVar108 = (float)local_d8._0_4_;
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                               ,0x67);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                    std::ostream::put(-0x30);
                    std::ostream::flush();
                    fVar76 = *(float *)((long)&(pAVar15->l).vx.field_0 + lVar68 + 0xc);
                    fVar103 = *(float *)((long)pAVar15 + lVar68 + -0x24);
                    fVar127 = *(float *)((long)pAVar15 + lVar68 + -0x14);
                    fVar128 = *(float *)((long)pAVar15 + lVar68 + -4);
                    auVar10 = *(undefined1 (*) [16])((long)pAVar15 + lVar68 + -0x30);
                    pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x20);
                    fVar113 = *pfVar3;
                    fVar122 = pfVar3[1];
                    pfVar4 = (float *)((long)pAVar15 + lVar68 + -0x10);
                    fVar104 = *pfVar4;
                    fVar106 = pfVar4[1];
                    fVar100 = pfVar4[2];
                    fVar130 = fVar103 * fVar127 + fVar76 * fVar128;
                    fVar101 = fVar103 * fVar127 - fVar76 * fVar128;
                    fVar116 = fVar76 * fVar76 + fVar103 * fVar103 + -fVar127 * fVar127 +
                              -fVar128 * fVar128;
                    fVar119 = fVar76 * fVar76 - fVar103 * fVar103;
                    fVar107 = fVar127 * fVar127 + fVar119 + -fVar128 * fVar128;
                    fVar138 = fVar103 * fVar128 - fVar76 * fVar127;
                    fVar90 = fVar76 * fVar127 + fVar103 * fVar128;
                    fVar135 = fVar127 * fVar128 + fVar76 * fVar103;
                    fVar76 = fVar127 * fVar128 - fVar76 * fVar103;
                    pfVar4 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar68);
                    fVar108 = *pfVar4;
                    fVar99 = pfVar4[1];
                    fVar129 = pfVar4[2];
                    fVar130 = fVar130 + fVar130;
                    fVar138 = fVar138 + fVar138;
                    fVar101 = fVar101 + fVar101;
                    fVar135 = fVar135 + fVar135;
                    fVar90 = fVar90 + fVar90;
                    fVar76 = fVar76 + fVar76;
                    fVar103 = fVar128 * fVar128 + fVar119 + -fVar127 * fVar127;
                    fVar114 = fVar116 * 1.0 + fVar130 * 0.0 + fVar138 * 0.0;
                    fVar117 = fVar116 * 0.0 + fVar130 * 1.0 + fVar138 * 0.0;
                    fVar120 = fVar116 * 0.0 + fVar130 * 0.0 + fVar138 * 1.0;
                    fVar123 = fVar116 * 0.0 + fVar130 * 0.0 + fVar138 * 0.0;
                    fVar109 = fVar101 * 1.0 + fVar107 * 0.0 + fVar135 * 0.0;
                    fVar110 = fVar101 * 0.0 + fVar107 * 1.0 + fVar135 * 0.0;
                    fVar111 = fVar101 * 0.0 + fVar107 * 0.0 + fVar135 * 1.0;
                    fVar112 = fVar101 * 0.0 + fVar107 * 0.0 + fVar135 * 0.0;
                    fVar91 = fVar90 * 1.0 + fVar76 * 0.0 + fVar103 * 0.0;
                    fVar93 = fVar90 * 0.0 + fVar76 * 1.0 + fVar103 * 0.0;
                    fVar95 = fVar90 * 0.0 + fVar76 * 0.0 + fVar103 * 1.0;
                    fVar97 = fVar90 * 0.0 + fVar76 * 0.0 + fVar103 * 0.0;
                    local_188 = auVar10._4_4_;
                    fStack_184 = auVar10._8_4_;
                    local_168 = auVar10._0_4_;
                    fVar131 = local_168 * fVar114 + fVar109 * 0.0 + fVar91 * 0.0;
                    fVar132 = local_168 * fVar117 + fVar110 * 0.0 + fVar93 * 0.0;
                    fVar133 = local_168 * fVar120 + fVar111 * 0.0 + fVar95 * 0.0;
                    fVar134 = local_168 * fVar123 + fVar112 * 0.0 + fVar97 * 0.0;
                    fVar92 = fVar113 * fVar114 + fVar122 * fVar109 + fVar91 * 0.0;
                    fVar94 = fVar113 * fVar117 + fVar122 * fVar110 + fVar93 * 0.0;
                    fVar96 = fVar113 * fVar120 + fVar122 * fVar111 + fVar95 * 0.0;
                    fVar98 = fVar113 * fVar123 + fVar122 * fVar112 + fVar97 * 0.0;
                    fVar130 = fVar104 * fVar114 + fVar106 * fVar109 + fVar100 * fVar91;
                    fVar135 = fVar104 * fVar117 + fVar106 * fVar110 + fVar100 * fVar93;
                    fVar138 = fVar104 * fVar120 + fVar106 * fVar111 + fVar100 * fVar95;
                    fVar89 = fVar104 * fVar123 + fVar106 * fVar112 + fVar100 * fVar97;
                    fVar76 = *(float *)(lVar16 + 0xc + lVar68);
                    fVar103 = *(float *)(lVar16 + -0x24 + lVar68);
                    fVar127 = *(float *)(lVar16 + -0x14 + lVar68);
                    fVar128 = *(float *)(lVar16 + -4 + lVar68);
                    fVar119 = fVar103 * fVar127 + fVar76 * fVar128;
                    fVar101 = fVar103 * fVar127 - fVar76 * fVar128;
                    fVar116 = fVar76 * fVar76 + fVar103 * fVar103 + -fVar127 * fVar127 +
                              -fVar128 * fVar128;
                    fVar122 = fVar76 * fVar76 - fVar103 * fVar103;
                    fVar137 = fVar127 * fVar127 + fVar122 + -fVar128 * fVar128;
                    fVar136 = fVar103 * fVar128 - fVar76 * fVar127;
                    fVar105 = fVar76 * fVar127 + fVar103 * fVar128;
                    fVar139 = fVar127 * fVar128 + fVar76 * fVar103;
                    fVar90 = fVar127 * fVar128 - fVar76 * fVar103;
                    pfVar4 = (float *)(lVar16 + -0x30 + lVar68);
                    fVar76 = *pfVar4;
                    pfVar5 = (float *)(lVar16 + -0x20 + lVar68);
                    fVar103 = *pfVar5;
                    fVar113 = pfVar5[1];
                    fVar124 = fVar128 * fVar128 + fVar122 + -fVar127 * fVar127;
                    pfVar7 = (float *)(lVar16 + -0x10 + lVar68);
                    fVar127 = *pfVar7;
                    fVar128 = pfVar7[1];
                    fVar122 = pfVar7[2];
                    fVar119 = fVar119 + fVar119;
                    fVar136 = fVar136 + fVar136;
                    pfVar7 = (float *)(lVar16 + lVar68);
                    fVar104 = *pfVar7;
                    fVar106 = pfVar7[1];
                    fVar100 = pfVar7[2];
                    fVar107 = fVar116 * 1.0 + fVar119 * 0.0 + fVar136 * 0.0;
                    fVar102 = fVar116 * 0.0 + fVar119 * 1.0 + fVar136 * 0.0;
                    fVar136 = fVar116 * 0.0 + fVar119 * 0.0 + fVar136 * 1.0;
                    fVar101 = fVar101 + fVar101;
                    fVar139 = fVar139 + fVar139;
                    fVar105 = fVar105 + fVar105;
                    fVar90 = fVar90 + fVar90;
                    fVar116 = fVar101 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                    fVar119 = fVar101 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                    fVar101 = fVar101 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                    fVar137 = fVar105 * 1.0 + fVar90 * 0.0 + fVar124 * 0.0;
                    fVar139 = fVar105 * 0.0 + fVar90 * 1.0 + fVar124 * 0.0;
                    fVar105 = fVar105 * 0.0 + fVar90 * 0.0 + fVar124 * 1.0;
                    fVar115 = fVar76 * fVar107 + fVar116 * 0.0 + fVar137 * 0.0;
                    fVar118 = fVar76 * fVar102 + fVar119 * 0.0 + fVar139 * 0.0;
                    fVar121 = fVar76 * fVar136 + fVar101 * 0.0 + fVar105 * 0.0;
                    fVar76 = fVar103 * fVar107 + fVar113 * fVar116 + fVar137 * 0.0;
                    fVar90 = fVar103 * fVar102 + fVar113 * fVar119 + fVar139 * 0.0;
                    fVar124 = fVar103 * fVar136 + fVar113 * fVar101 + fVar105 * 0.0;
                    fVar125 = fVar127 * fVar107 + fVar128 * fVar116 + fVar122 * fVar137;
                    fVar126 = fVar127 * fVar102 + fVar128 * fVar119 + fVar122 * fVar139;
                    fVar127 = fVar127 * fVar136 + fVar128 * fVar101 + fVar122 * fVar105;
                    fVar137 = fVar104 * fVar107 + fVar106 * fVar116 + fVar100 * fVar137 +
                              pfVar4[1] + 0.0;
                    fVar102 = fVar104 * fVar102 + fVar106 * fVar119 + fVar100 * fVar139 +
                              pfVar4[2] + 0.0;
                    fVar136 = fVar104 * fVar136 + fVar106 * fVar101 + fVar100 * fVar105 +
                              pfVar5[2] + 0.0;
                    fVar101 = fVar115 * fVar131 + fVar118 * fVar92 + fVar121 * fVar130;
                    local_168 = fVar115 * fVar132 + fVar118 * fVar94 + fVar121 * fVar135;
                    fVar103 = fVar115 * fVar133 + fVar118 * fVar96 + fVar121 * fVar138;
                    fVar113 = fVar76 * fVar131 + fVar90 * fVar92 + fVar124 * fVar130;
                    fVar116 = fVar76 * fVar132 + fVar90 * fVar94 + fVar124 * fVar135;
                    fVar119 = fVar76 * fVar133 + fVar90 * fVar96 + fVar124 * fVar138;
                    fVar122 = fVar76 * fVar134 + fVar90 * fVar98 + fVar124 * fVar89;
                    fVar104 = fVar125 * fVar131 + fVar126 * fVar92 + fVar127 * fVar130;
                    fVar106 = fVar125 * fVar132 + fVar126 * fVar94 + fVar127 * fVar135;
                    fVar107 = fVar125 * fVar133 + fVar126 * fVar96 + fVar127 * fVar138;
                    psVar67 = extraout_RDX_08;
                    fVar100 = fVar125 * fVar134 + fVar126 * fVar98 + fVar127 * fVar89;
                    fVar76 = fVar115 * fVar134 + fVar118 * fVar98 + fVar121 * fVar89;
                    fVar127 = fVar137 * fVar131 + fVar102 * fVar92 + fVar136 * fVar130 +
                              fVar108 * fVar114 + fVar99 * fVar109 + fVar129 * fVar91 +
                              local_188 + 0.0;
                    fVar128 = fVar137 * fVar132 + fVar102 * fVar94 + fVar136 * fVar135 +
                              fVar108 * fVar117 + fVar99 * fVar110 + fVar129 * fVar93 +
                              fStack_184 + 0.0;
                    fVar90 = fVar137 * fVar133 + fVar102 * fVar96 + fVar136 * fVar138 +
                             fVar108 * fVar120 + fVar99 * fVar111 + fVar129 * fVar95 +
                             pfVar3[2] + 0.0;
                    fVar108 = fVar137 * fVar134 + fVar102 * fVar98 + fVar136 * fVar89 +
                              fVar108 * fVar123 + fVar99 * fVar112 + fVar129 * fVar97 + 0.0;
                  }
                }
                else {
                  pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x24);
                  auVar10._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar10._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar10._8_4_ = -(uint)(pfVar3[2] != 1.0);
                  auVar10._12_4_ = -(uint)(pfVar3[3] != 0.0);
                  uVar72 = movmskps(uVar72,auVar10);
                  if ((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                     (((uVar72 & 4) != 0 ||
                      (bVar66 = ((byte)uVar72 & 8) >> 3,
                      uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66), bVar66 != 0))))
                  goto LAB_001692cf;
                  pfVar3 = (float *)((long)pAVar15 + lVar68 + -0x14);
                  auVar26._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar26._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar26._8_4_ = -(uint)(pfVar3[2] != 0.0);
                  auVar26._12_4_ = -(uint)(pfVar3[3] != 1.0);
                  uVar72 = movmskps(uVar72,auVar26);
                  if (((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) ||
                      ((uVar72 & 4) != 0)) ||
                     (bVar66 = ((byte)uVar72 & 8) >> 3,
                     uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66), bVar66 != 0)) goto LAB_001692cf;
                  pfVar3 = (float *)((long)pAVar15 + lVar68 + -4);
                  auVar27._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar27._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar27._8_4_ = -(uint)(pfVar3[2] != 0.0);
                  auVar27._12_4_ = -(uint)(pfVar3[3] != 0.0);
                  uVar72 = movmskps(uVar72,auVar27);
                  if ((((bVar11 & (byte)uVar72) != 0) || ((uVar72 & 2) != 0)) || ((uVar72 & 4) != 0)
                     ) goto LAB_001692cf;
                  bVar66 = ((byte)uVar72 & 8) >> 3;
                  uVar72 = CONCAT31((int3)(uVar72 >> 8),bVar66);
                  psVar67 = (size_t *)(ulong)uVar72;
                  if ((bVar66 != 0) ||
                     ((bVar11 != 0 &&
                      ((fVar76 = *(float *)((long)&(pAVar15->l).vx.field_0 + lVar68 + 0xc),
                       fVar76 != 1.0 || (NAN(fVar76))))))) goto LAB_001692cf;
                  pfVar3 = (float *)(lVar16 + -0x30 + lVar68);
                  fVar101 = *pfVar3;
                  local_168 = pfVar3[1];
                  fVar103 = pfVar3[2];
                  fVar76 = pfVar3[3];
                  pfVar3 = (float *)(lVar16 + -0x20 + lVar68);
                  fVar113 = *pfVar3;
                  fVar116 = pfVar3[1];
                  fVar119 = pfVar3[2];
                  fVar122 = pfVar3[3];
                  pfVar3 = (float *)(lVar16 + -0x10 + lVar68);
                  fVar104 = *pfVar3;
                  fVar106 = pfVar3[1];
                  fVar107 = pfVar3[2];
                  fVar100 = pfVar3[3];
                  pfVar3 = (float *)(lVar16 + lVar68);
                  fVar127 = *pfVar3;
                  fVar128 = pfVar3[1];
                  fVar90 = pfVar3[2];
                  fVar108 = pfVar3[3];
                  local_158.quaternion = (bool)bVar12;
                }
LAB_00169dc3:
                pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x30);
                *pfVar3 = fVar101;
                pfVar3[1] = local_168;
                pfVar3[2] = fVar103;
                pfVar3[3] = fVar76;
                pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x20);
                *pfVar3 = fVar113;
                pfVar3[1] = fVar116;
                pfVar3[2] = fVar119;
                pfVar3[3] = fVar122;
                pfVar3 = (float *)((long)local_158.spaces.items + lVar68 + -0x10);
                *pfVar3 = fVar104;
                pfVar3[1] = fVar106;
                pfVar3[2] = fVar107;
                pfVar3[3] = fVar100;
                pfVar3 = (float *)((long)&((local_158.spaces.items)->l).vx.field_0 + lVar68);
                *pfVar3 = fVar127;
                pfVar3[1] = fVar128;
                pfVar3[2] = fVar90;
                pfVar3[3] = fVar108;
                uVar70 = uVar70 + 1;
                lVar68 = lVar68 + 0x40;
                pAVar61 = local_158.spaces.items;
              } while (uVar70 < *(ulong *)&(pLVar2->vy).field_0);
            }
          }
          convertInstances(local_90,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                     *)local_98,local_68,&local_158);
          alignedFree(local_158.spaces.items);
          local_158.spaces.size_active = 0;
          local_158.spaces.size_alloced = 0;
          local_158.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
          uVar70 = local_88 + 1;
          pAVar61 = *(AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **)local_38;
        } while (uVar70 < (ulong)(((long)local_38->_M_parent - (long)pAVar61 >> 4) *
                                 -0x5555555555555555));
      }
    }
    if (plVar60 != (long *)0x0) {
      (**(code **)(*plVar60 + 0x18))(plVar60);
    }
  }
  return;
}

Assistant:

void convertInstances(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node, const std::vector<SceneGraph::Transformations>& spaces)
    {
      if (node->isClosed()) {
        //if (group.size() % 10000 == 0) std::cout << "." << std::flush;
        group.push_back(new SceneGraph::MultiTransformNode(spaces,lookupGeometries(node)));
      }
      else if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        for (size_t i = 0; i < spaces.size(); ++i)
          convertInstances(group,xfmNode->child, spaces[i]*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
        convertInstances(group,xfmNode->child, spaces*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertInstances(group,child,spaces);
      }
    }